

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::sse2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  undefined8 uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined6 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  int iVar42;
  undefined4 uVar43;
  long lVar44;
  undefined4 uVar49;
  ulong extraout_RAX;
  ulong uVar45;
  RayHitK<4> *pRVar46;
  ulong extraout_RAX_00;
  RTCFilterFunctionN p_Var47;
  undefined1 (*pauVar48) [16];
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  int iVar53;
  ulong uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  short sVar60;
  float fVar61;
  float fVar62;
  float fVar100;
  float fVar102;
  __m128 a_2;
  undefined2 uVar99;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  float fVar101;
  float fVar103;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float pp;
  float fVar104;
  float fVar137;
  float fVar138;
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar154;
  float fVar155;
  vfloat4 a;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar168;
  float fVar169;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar180;
  float fVar181;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar182;
  float fVar196;
  float fVar197;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar208;
  float fVar209;
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar228;
  float fVar229;
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar230;
  float fVar236;
  float fVar237;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar243;
  float fVar244;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar245;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  float fVar253;
  float fVar260;
  float fVar262;
  undefined1 auVar254 [16];
  float fVar264;
  undefined1 auVar257 [16];
  float fVar261;
  float fVar263;
  float fVar265;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar266;
  float fVar270;
  float fVar271;
  __m128 a_1;
  float fVar272;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_688 [8];
  float fStack_680;
  float fStack_67c;
  undefined1 local_628 [8];
  float fStack_620;
  float fStack_61c;
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined8 local_608;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined8 local_5c8;
  uint uStack_5c0;
  uint uStack_5bc;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [4];
  float fStack_5a4;
  undefined8 uStack_5a0;
  RTCRayQueryContext *local_598;
  RayHitK<4> *local_590;
  RTCHitN *local_588;
  uint local_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  undefined4 uStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 (*local_478) [16];
  Primitive *local_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 uVar98;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  
  PVar6 = prim[1];
  uVar45 = (ulong)(byte)PVar6;
  lVar14 = uVar45 * 0x19;
  pPVar1 = prim + lVar14 + 6;
  fVar155 = *(float *)(pPVar1 + 0xc);
  fVar170 = (*(float *)(ray + k * 4) - *(float *)pPVar1) * fVar155;
  fVar180 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar1 + 4)) * fVar155;
  fVar181 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar1 + 8)) * fVar155;
  fVar139 = *(float *)(ray + k * 4 + 0x40) * fVar155;
  fVar154 = *(float *)(ray + k * 4 + 0x50) * fVar155;
  fVar155 = *(float *)(ray + k * 4 + 0x60) * fVar155;
  uVar49 = *(undefined4 *)(prim + uVar45 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar54;
  auVar70._12_2_ = uVar99;
  auVar70._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar185._12_4_ = auVar70._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar54;
  auVar185._10_2_ = uVar99;
  auVar186._10_6_ = auVar185._10_6_;
  auVar186._8_2_ = uVar99;
  auVar186._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar27._4_8_ = auVar186._8_8_;
  auVar27._2_2_ = uVar99;
  auVar27._0_2_ = uVar99;
  fVar104 = (float)((int)sVar60 >> 8);
  fVar137 = (float)(auVar27._0_4_ >> 0x18);
  fVar138 = (float)(auVar186._8_4_ >> 0x18);
  uVar49 = *(undefined4 *)(prim + uVar45 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar54;
  auVar205._12_2_ = uVar99;
  auVar205._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar226._12_4_ = auVar205._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar54;
  auVar226._10_2_ = uVar99;
  auVar63._10_6_ = auVar226._10_6_;
  auVar63._8_2_ = uVar99;
  auVar63._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar28._4_8_ = auVar63._8_8_;
  auVar28._2_2_ = uVar99;
  auVar28._0_2_ = uVar99;
  fVar182 = (float)((int)sVar60 >> 8);
  fVar196 = (float)(auVar28._0_4_ >> 0x18);
  fVar197 = (float)(auVar63._8_4_ >> 0x18);
  uVar49 = *(undefined4 *)(prim + uVar45 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar54;
  auVar66._12_2_ = uVar99;
  auVar66._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar54;
  auVar65._10_2_ = uVar99;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar99;
  auVar64._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar29._4_8_ = auVar64._8_8_;
  auVar29._2_2_ = uVar99;
  auVar29._0_2_ = uVar99;
  fVar156 = (float)((int)sVar60 >> 8);
  fVar168 = (float)(auVar29._0_4_ >> 0x18);
  fVar169 = (float)(auVar64._8_4_ >> 0x18);
  uVar49 = *(undefined4 *)(prim + uVar45 * 0xb + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar54;
  auVar69._12_2_ = uVar99;
  auVar69._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar54;
  auVar68._10_2_ = uVar99;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar99;
  auVar67._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar30._4_8_ = auVar67._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  fVar61 = (float)((int)sVar60 >> 8);
  fVar100 = (float)(auVar30._0_4_ >> 0x18);
  fVar102 = (float)(auVar67._8_4_ >> 0x18);
  uVar49 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar54;
  auVar201._12_2_ = uVar99;
  auVar201._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar54;
  auVar200._10_2_ = uVar99;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar99;
  auVar199._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar31._4_8_ = auVar199._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar198 = (float)((int)sVar60 >> 8);
  fVar208 = (float)(auVar31._0_4_ >> 0x18);
  fVar209 = (float)(auVar199._8_4_ >> 0x18);
  uVar49 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar45 + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar54;
  auVar213._12_2_ = uVar99;
  auVar213._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar54;
  auVar212._10_2_ = uVar99;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar99;
  auVar211._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar32._4_8_ = auVar211._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar238 = (float)((int)sVar60 >> 8);
  fVar243 = (float)(auVar32._0_4_ >> 0x18);
  fVar244 = (float)(auVar211._8_4_ >> 0x18);
  uVar51 = (ulong)(uint)((int)(uVar45 * 9) * 2);
  uVar49 = *(undefined4 *)(prim + uVar51 + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar54;
  auVar216._12_2_ = uVar99;
  auVar216._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar54;
  auVar215._10_2_ = uVar99;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar99;
  auVar214._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar33._4_8_ = auVar214._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar230 = (float)((int)sVar60 >> 8);
  fVar236 = (float)(auVar33._0_4_ >> 0x18);
  fVar237 = (float)(auVar214._8_4_ >> 0x18);
  uVar49 = *(undefined4 *)(prim + uVar51 + uVar45 + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar54;
  auVar219._12_2_ = uVar99;
  auVar219._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar54;
  auVar218._10_2_ = uVar99;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar99;
  auVar217._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar34._4_8_ = auVar217._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar245 = (float)((int)sVar60 >> 8);
  fVar249 = (float)(auVar34._0_4_ >> 0x18);
  fVar250 = (float)(auVar217._8_4_ >> 0x18);
  uVar52 = (ulong)(uint)((int)(uVar45 * 5) << 2);
  uVar49 = *(undefined4 *)(prim + uVar52 + 6);
  uVar98 = (undefined1)((uint)uVar49 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar49 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar49));
  uVar98 = (undefined1)((uint)uVar49 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar49,(char)uVar49);
  uVar54 = CONCAT62(uVar26,sVar60);
  auVar256._8_4_ = 0;
  auVar256._0_8_ = uVar54;
  auVar256._12_2_ = uVar99;
  auVar256._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar54;
  auVar255._10_2_ = uVar99;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._8_2_ = uVar99;
  auVar254._0_8_ = uVar54;
  uVar99 = (undefined2)uVar26;
  auVar35._4_8_ = auVar254._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  fVar62 = (float)((int)sVar60 >> 8);
  fVar101 = (float)(auVar35._0_4_ >> 0x18);
  fVar103 = (float)(auVar254._8_4_ >> 0x18);
  fVar266 = fVar139 * fVar104 + fVar154 * fVar182 + fVar155 * fVar156;
  fVar270 = fVar139 * fVar137 + fVar154 * fVar196 + fVar155 * fVar168;
  fVar271 = fVar139 * fVar138 + fVar154 * fVar197 + fVar155 * fVar169;
  fVar272 = fVar139 * (float)(auVar185._12_4_ >> 0x18) +
            fVar154 * (float)(auVar226._12_4_ >> 0x18) + fVar155 * (float)(auVar65._12_4_ >> 0x18);
  fVar252 = fVar139 * fVar61 + fVar154 * fVar198 + fVar155 * fVar238;
  fVar260 = fVar139 * fVar100 + fVar154 * fVar208 + fVar155 * fVar243;
  fVar262 = fVar139 * fVar102 + fVar154 * fVar209 + fVar155 * fVar244;
  fVar264 = fVar139 * (float)(auVar68._12_4_ >> 0x18) +
            fVar154 * (float)(auVar200._12_4_ >> 0x18) + fVar155 * (float)(auVar212._12_4_ >> 0x18);
  fVar210 = fVar139 * fVar230 + fVar154 * fVar245 + fVar155 * fVar62;
  fVar228 = fVar139 * fVar236 + fVar154 * fVar249 + fVar155 * fVar101;
  fVar229 = fVar139 * fVar237 + fVar154 * fVar250 + fVar155 * fVar103;
  fVar139 = fVar139 * (float)(auVar215._12_4_ >> 0x18) +
            fVar154 * (float)(auVar218._12_4_ >> 0x18) + fVar155 * (float)(auVar255._12_4_ >> 0x18);
  uVar49 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar156 = fVar104 * fVar170 + fVar182 * fVar180 + fVar156 * fVar181;
  fVar168 = fVar137 * fVar170 + fVar196 * fVar180 + fVar168 * fVar181;
  fVar169 = fVar138 * fVar170 + fVar197 * fVar180 + fVar169 * fVar181;
  fVar182 = (float)(auVar185._12_4_ >> 0x18) * fVar170 +
            (float)(auVar226._12_4_ >> 0x18) * fVar180 + (float)(auVar65._12_4_ >> 0x18) * fVar181;
  fVar238 = fVar61 * fVar170 + fVar198 * fVar180 + fVar238 * fVar181;
  fVar208 = fVar100 * fVar170 + fVar208 * fVar180 + fVar243 * fVar181;
  fVar209 = fVar102 * fVar170 + fVar209 * fVar180 + fVar244 * fVar181;
  fVar243 = (float)(auVar68._12_4_ >> 0x18) * fVar170 +
            (float)(auVar200._12_4_ >> 0x18) * fVar180 + (float)(auVar212._12_4_ >> 0x18) * fVar181;
  fVar196 = fVar170 * fVar230 + fVar180 * fVar245 + fVar181 * fVar62;
  fVar197 = fVar170 * fVar236 + fVar180 * fVar249 + fVar181 * fVar101;
  fVar198 = fVar170 * fVar237 + fVar180 * fVar250 + fVar181 * fVar103;
  fVar170 = fVar170 * (float)(auVar215._12_4_ >> 0x18) +
            fVar180 * (float)(auVar218._12_4_ >> 0x18) + fVar181 * (float)(auVar255._12_4_ >> 0x18);
  fVar155 = (float)DAT_01f80d30;
  fVar61 = DAT_01f80d30._4_4_;
  fVar62 = DAT_01f80d30._8_4_;
  fVar100 = DAT_01f80d30._12_4_;
  uVar55 = -(uint)(fVar155 <= ABS(fVar266));
  uVar56 = -(uint)(fVar61 <= ABS(fVar270));
  uVar57 = -(uint)(fVar62 <= ABS(fVar271));
  uVar58 = -(uint)(fVar100 <= ABS(fVar272));
  auVar267._0_4_ = (uint)fVar266 & uVar55;
  auVar267._4_4_ = (uint)fVar270 & uVar56;
  auVar267._8_4_ = (uint)fVar271 & uVar57;
  auVar267._12_4_ = (uint)fVar272 & uVar58;
  auVar171._0_4_ = ~uVar55 & (uint)fVar155;
  auVar171._4_4_ = ~uVar56 & (uint)fVar61;
  auVar171._8_4_ = ~uVar57 & (uint)fVar62;
  auVar171._12_4_ = ~uVar58 & (uint)fVar100;
  auVar171 = auVar171 | auVar267;
  uVar55 = -(uint)(fVar155 <= ABS(fVar252));
  uVar56 = -(uint)(fVar61 <= ABS(fVar260));
  uVar57 = -(uint)(fVar62 <= ABS(fVar262));
  uVar58 = -(uint)(fVar100 <= ABS(fVar264));
  auVar257._0_4_ = (uint)fVar252 & uVar55;
  auVar257._4_4_ = (uint)fVar260 & uVar56;
  auVar257._8_4_ = (uint)fVar262 & uVar57;
  auVar257._12_4_ = (uint)fVar264 & uVar58;
  auVar183._0_4_ = ~uVar55 & (uint)fVar155;
  auVar183._4_4_ = ~uVar56 & (uint)fVar61;
  auVar183._8_4_ = ~uVar57 & (uint)fVar62;
  auVar183._12_4_ = ~uVar58 & (uint)fVar100;
  auVar183 = auVar183 | auVar257;
  uVar55 = -(uint)(fVar155 <= ABS(fVar210));
  uVar56 = -(uint)(fVar61 <= ABS(fVar228));
  uVar57 = -(uint)(fVar62 <= ABS(fVar229));
  uVar58 = -(uint)(fVar100 <= ABS(fVar139));
  auVar220._0_4_ = (uint)fVar210 & uVar55;
  auVar220._4_4_ = (uint)fVar228 & uVar56;
  auVar220._8_4_ = (uint)fVar229 & uVar57;
  auVar220._12_4_ = (uint)fVar139 & uVar58;
  auVar202._0_4_ = ~uVar55 & (uint)fVar155;
  auVar202._4_4_ = ~uVar56 & (uint)fVar61;
  auVar202._8_4_ = ~uVar57 & (uint)fVar62;
  auVar202._12_4_ = ~uVar58 & (uint)fVar100;
  auVar202 = auVar202 | auVar220;
  auVar70 = rcpps(_DAT_01f80d30,auVar171);
  fVar155 = auVar70._0_4_;
  fVar100 = auVar70._4_4_;
  fVar103 = auVar70._8_4_;
  fVar138 = auVar70._12_4_;
  fVar155 = (1.0 - auVar171._0_4_ * fVar155) * fVar155 + fVar155;
  fVar100 = (1.0 - auVar171._4_4_ * fVar100) * fVar100 + fVar100;
  fVar103 = (1.0 - auVar171._8_4_ * fVar103) * fVar103 + fVar103;
  fVar138 = (1.0 - auVar171._12_4_ * fVar138) * fVar138 + fVar138;
  auVar70 = rcpps(auVar70,auVar183);
  fVar61 = auVar70._0_4_;
  fVar101 = auVar70._4_4_;
  fVar104 = auVar70._8_4_;
  fVar139 = auVar70._12_4_;
  fVar61 = (1.0 - auVar183._0_4_ * fVar61) * fVar61 + fVar61;
  fVar101 = (1.0 - auVar183._4_4_ * fVar101) * fVar101 + fVar101;
  fVar104 = (1.0 - auVar183._8_4_ * fVar104) * fVar104 + fVar104;
  fVar139 = (1.0 - auVar183._12_4_ * fVar139) * fVar139 + fVar139;
  auVar70 = rcpps(auVar70,auVar202);
  fVar62 = auVar70._0_4_;
  fVar102 = auVar70._4_4_;
  fVar137 = auVar70._8_4_;
  fVar154 = auVar70._12_4_;
  fVar62 = (1.0 - auVar202._0_4_ * fVar62) * fVar62 + fVar62;
  fVar102 = (1.0 - auVar202._4_4_ * fVar102) * fVar102 + fVar102;
  fVar137 = (1.0 - auVar202._8_4_ * fVar137) * fVar137 + fVar137;
  fVar154 = (1.0 - auVar202._12_4_ * fVar154) * fVar154 + fVar154;
  uVar54 = *(ulong *)(prim + uVar45 * 7 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar54;
  auVar73._12_2_ = uVar99;
  auVar73._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar54;
  auVar72._10_2_ = uVar99;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar99;
  auVar71._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar36._4_8_ = auVar71._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  auVar172._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar168) * fVar100,
                ((float)(int)(short)uVar54 - fVar156) * fVar155);
  auVar172._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar169) * fVar103;
  auVar172._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar182) * fVar138;
  uVar54 = *(ulong *)(prim + uVar45 * 9 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar54;
  auVar76._12_2_ = uVar99;
  auVar76._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar54;
  auVar75._10_2_ = uVar99;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar99;
  auVar74._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar37._4_8_ = auVar74._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  auVar203._0_4_ = ((float)(int)(short)uVar54 - fVar156) * fVar155;
  auVar203._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar168) * fVar100;
  auVar203._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar169) * fVar103;
  auVar203._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar182) * fVar138;
  uVar54 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar45 * -2 + 6);
  uVar99 = (undefined2)(uVar51 >> 0x30);
  auVar107._8_4_ = 0;
  auVar107._0_8_ = uVar51;
  auVar107._12_2_ = uVar99;
  auVar107._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar51 >> 0x20);
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = uVar51;
  auVar106._10_2_ = uVar99;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._8_2_ = uVar99;
  auVar105._0_8_ = uVar51;
  uVar99 = (undefined2)(uVar51 >> 0x10);
  auVar38._4_8_ = auVar105._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  auVar108._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar208) * fVar101,
                ((float)(int)(short)uVar51 - fVar238) * fVar61);
  auVar108._8_4_ = ((float)(auVar105._8_4_ >> 0x10) - fVar209) * fVar104;
  auVar108._12_4_ = ((float)(auVar106._12_4_ >> 0x10) - fVar243) * fVar139;
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar54;
  auVar79._12_2_ = uVar99;
  auVar79._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar54;
  auVar78._10_2_ = uVar99;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar99;
  auVar77._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar39._4_8_ = auVar77._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  auVar231._0_4_ = ((float)(int)(short)uVar54 - fVar238) * fVar61;
  auVar231._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar208) * fVar101;
  auVar231._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar209) * fVar104;
  auVar231._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar243) * fVar139;
  uVar54 = *(ulong *)(prim + uVar52 + uVar45 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar54;
  auVar82._12_2_ = uVar99;
  auVar82._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar54;
  auVar81._10_2_ = uVar99;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar99;
  auVar80._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar40._4_8_ = auVar80._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  auVar83._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar197) * fVar102,
                ((float)(int)(short)uVar54 - fVar196) * fVar62);
  auVar83._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar198) * fVar137;
  auVar83._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar170) * fVar154;
  local_470 = prim;
  uVar54 = *(ulong *)(prim + uVar45 * 0x17 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar54;
  auVar223._12_2_ = uVar99;
  auVar223._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar54;
  auVar222._10_2_ = uVar99;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar99;
  auVar221._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar41._4_8_ = auVar221._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  auVar224._0_4_ = ((float)(int)(short)uVar54 - fVar196) * fVar62;
  auVar224._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar197) * fVar102;
  auVar224._8_4_ = ((float)(auVar221._8_4_ >> 0x10) - fVar198) * fVar137;
  auVar224._12_4_ = ((float)(auVar222._12_4_ >> 0x10) - fVar170) * fVar154;
  auVar184._8_4_ = auVar172._8_4_;
  auVar184._0_8_ = auVar172._0_8_;
  auVar184._12_4_ = auVar172._12_4_;
  auVar185 = minps(auVar184,auVar203);
  auVar140._8_4_ = auVar108._8_4_;
  auVar140._0_8_ = auVar108._0_8_;
  auVar140._12_4_ = auVar108._12_4_;
  auVar70 = minps(auVar140,auVar231);
  auVar185 = maxps(auVar185,auVar70);
  auVar141._8_4_ = auVar83._8_4_;
  auVar141._0_8_ = auVar83._0_8_;
  auVar141._12_4_ = auVar83._12_4_;
  auVar70 = minps(auVar141,auVar224);
  auVar157._4_4_ = uVar49;
  auVar157._0_4_ = uVar49;
  auVar157._8_4_ = uVar49;
  auVar157._12_4_ = uVar49;
  auVar70 = maxps(auVar70,auVar157);
  auVar186 = maxps(auVar185,auVar70);
  auVar185 = maxps(auVar172,auVar203);
  auVar70 = maxps(auVar108,auVar231);
  auVar185 = minps(auVar185,auVar70);
  local_2b8 = auVar186._0_4_ * 0.99999964;
  fStack_2b4 = auVar186._4_4_ * 0.99999964;
  fStack_2b0 = auVar186._8_4_ * 0.99999964;
  fStack_2ac = auVar186._12_4_ * 0.99999964;
  auVar70 = maxps(auVar83,auVar224);
  uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar109._4_4_ = uVar49;
  auVar109._0_4_ = uVar49;
  auVar109._8_4_ = uVar49;
  auVar109._12_4_ = uVar49;
  auVar70 = minps(auVar70,auVar109);
  auVar70 = minps(auVar185,auVar70);
  auVar110._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_2b8 <= auVar70._0_4_ * 1.0000004);
  auVar110._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_2b4 <= auVar70._4_4_ * 1.0000004);
  auVar110._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_2b0 <= auVar70._8_4_ * 1.0000004);
  auVar110._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_2ac <= auVar70._12_4_ * 1.0000004);
  uVar55 = movmskps((uint)(byte)PVar6,auVar110);
  if (uVar55 == 0) {
    return;
  }
  uVar55 = uVar55 & 0xff;
  local_1f8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1f8._12_4_ = 0;
  local_478 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00a22257:
  uVar54 = (ulong)uVar55;
  lVar44 = 0;
  if (uVar54 != 0) {
    for (; (uVar55 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
    }
  }
  uVar54 = uVar54 - 1 & uVar54;
  fVar155 = *(float *)(local_470 + lVar44 * 4 + 6);
  lVar44 = lVar44 * 0x40;
  lVar8 = 0;
  if (uVar54 != 0) {
    for (; (uVar54 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  uVar55 = *(uint *)(local_470 + 2);
  pPVar1 = prim + lVar44 + lVar14 + 0x16;
  if (((uVar54 != 0) && (uVar51 = uVar54 - 1 & uVar54, uVar51 != 0)) && (lVar8 = 0, uVar51 != 0)) {
    for (; (uVar51 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  pPVar2 = prim + lVar44 + lVar14 + 0x26;
  pPVar3 = prim + lVar44 + lVar14 + 0x36;
  pPVar4 = prim + lVar44 + lVar14 + 0x46;
  fStack_13c = *(float *)(ray + k * 4 + 0x40);
  local_618._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
  local_548 = *(float *)(ray + k * 4 + 0x60);
  fVar61 = (float)local_618._4_4_ * (float)local_618._4_4_;
  fVar100 = local_548 * local_548;
  fVar62 = fVar61 + fStack_13c * fStack_13c + fVar100;
  auVar84._0_8_ = CONCAT44(fVar61 + fVar61 + 0.0,fVar62);
  auVar84._8_4_ = fVar61 + fVar100 + fVar100;
  auVar84._12_4_ = fVar61 + 0.0 + 0.0;
  auVar187._8_4_ = auVar84._8_4_;
  auVar187._0_8_ = auVar84._0_8_;
  auVar187._12_4_ = auVar84._12_4_;
  auVar70 = rcpss(auVar187,auVar84);
  local_558 = (2.0 - auVar70._0_4_ * fVar62) * auVar70._0_4_ *
              (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
                *(float *)(pPVar4 + 8)) * 0.25 - *(float *)(ray + k * 4 + 0x20)) * local_548 +
              ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
               *(float *)(pPVar4 + 4)) * 0.25 - *(float *)(ray + k * 4 + 0x10)) *
              (float)local_618._4_4_ +
              ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
              *(float *)(ray + k * 4)) * fStack_13c);
  local_518._4_4_ = local_618._4_4_;
  local_518._0_4_ = fStack_13c;
  fStack_510 = local_548;
  fStack_50c = 0.0;
  fStack_554 = local_558;
  fStack_550 = local_558;
  fStack_54c = local_558;
  local_188 = fStack_13c * local_558 + *(float *)(ray + k * 4);
  local_198 = (float)local_618._4_4_ * local_558 + *(float *)(ray + k * 4 + 0x10);
  local_1a8 = local_548 * local_558 + *(float *)(ray + k * 4 + 0x20);
  fVar101 = *(float *)pPVar1 - local_188;
  fVar102 = *(float *)(pPVar1 + 4) - local_198;
  fVar103 = *(float *)(pPVar1 + 8) - local_1a8;
  fVar104 = *(float *)(pPVar1 + 0xc) - 0.0;
  local_168 = *(float *)pPVar3 - local_188;
  fStack_424 = *(float *)(pPVar3 + 4) - local_198;
  local_178 = *(float *)(pPVar3 + 8) - local_1a8;
  fStack_41c = *(float *)(pPVar3 + 0xc) - 0.0;
  local_418 = *(float *)pPVar2 - local_188;
  fStack_414 = *(float *)(pPVar2 + 4) - local_198;
  fStack_410 = *(float *)(pPVar2 + 8) - local_1a8;
  fStack_40c = *(float *)(pPVar2 + 0xc) - 0.0;
  local_188 = *(float *)pPVar4 - local_188;
  local_198 = *(float *)(pPVar4 + 4) - local_198;
  local_1a8 = *(float *)(pPVar4 + 8) - local_1a8;
  fStack_42c = *(float *)(pPVar4 + 0xc) - 0.0;
  local_158 = fVar102;
  fStack_154 = fVar102;
  fStack_150 = fVar102;
  fStack_14c = fVar102;
  fVar61 = (float)local_618._4_4_ * (float)local_618._4_4_;
  fStack_13c = fStack_13c * fStack_13c;
  local_148 = fStack_13c + fVar61 + fVar100;
  fStack_144 = fStack_13c + fVar61 + fVar100;
  fStack_140 = fStack_13c + fVar61 + fVar100;
  fStack_13c = fStack_13c + fVar61 + fVar100;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  local_428 = local_168;
  fStack_420 = local_178;
  local_378 = fStack_41c;
  fStack_374 = fStack_41c;
  fStack_370 = fStack_41c;
  fStack_36c = fStack_41c;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_1a4 = local_1a8;
  fStack_1a0 = local_1a8;
  fStack_19c = local_1a8;
  local_438 = local_188;
  fStack_434 = local_198;
  fStack_430 = local_1a8;
  local_1b8 = fStack_42c;
  fStack_1b4 = fStack_42c;
  fStack_1b0 = fStack_42c;
  fStack_1ac = fStack_42c;
  local_448 = *(float *)(ray + k * 4 + 0x40);
  fStack_444 = local_448;
  fStack_440 = local_448;
  fStack_43c = local_448;
  fStack_544 = local_548;
  fStack_540 = local_548;
  fStack_53c = local_548;
  local_388 = ABS(local_148);
  fStack_384 = ABS(fStack_144);
  fStack_380 = ABS(fStack_140);
  fStack_37c = ABS(fStack_13c);
  fVar61 = *(float *)(ray + k * 4 + 0x30);
  local_3d8 = ZEXT416((uint)local_558);
  local_1e8 = fVar61 - local_558;
  fStack_1e4 = local_1e8;
  fStack_1e0 = local_1e8;
  fStack_1dc = local_1e8;
  local_398 = uVar55;
  uStack_394 = uVar55;
  uStack_390 = uVar55;
  uStack_38c = uVar55;
  local_3a8 = fVar155;
  uStack_3a4 = fVar155;
  uStack_3a0 = fVar155;
  uStack_39c = fVar155;
  iVar50 = 1;
  uVar51 = 0;
  local_1d8 = 0.0;
  fStack_1d4 = 1.0;
  local_618._0_4_ = local_618._4_4_;
  fStack_610 = (float)local_618._4_4_;
  fStack_60c = (float)local_618._4_4_;
  local_238 = fVar101;
  fStack_234 = fVar101;
  fStack_230 = fVar101;
  fStack_22c = fVar101;
  local_248 = fVar103;
  fStack_244 = fVar103;
  fStack_240 = fVar103;
  fStack_23c = fVar103;
  local_258 = fVar104;
  fStack_254 = fVar104;
  fStack_250 = fVar104;
  fStack_24c = fVar104;
  local_268 = local_418;
  fStack_264 = local_418;
  fStack_260 = local_418;
  fStack_25c = local_418;
  local_278 = fStack_414;
  fStack_274 = fStack_414;
  fStack_270 = fStack_414;
  fStack_26c = fStack_414;
  local_458 = fStack_410;
  fStack_454 = fStack_410;
  fStack_450 = fStack_410;
  fStack_44c = fStack_410;
  local_468 = fStack_40c;
  fStack_464 = fStack_40c;
  fStack_460 = fStack_40c;
  fStack_45c = fStack_40c;
  local_288 = fStack_424;
  fStack_284 = fStack_424;
  fStack_280 = fStack_424;
  fStack_27c = fStack_424;
  do {
    iVar53 = (int)uVar51;
    fVar180 = fStack_1d4 - local_1d8;
    uStack_1d0 = 0;
    uStack_1cc = 0;
    local_568._4_4_ = local_1d8;
    local_568._0_4_ = local_1d8;
    fStack_560 = local_1d8;
    fStack_55c = local_1d8;
    fVar137 = fVar180 * 0.0 + local_1d8;
    fVar138 = fVar180 * 0.33333334 + local_1d8;
    fVar139 = fVar180 * 0.6666667 + local_1d8;
    fVar154 = fVar180 * 1.0 + local_1d8;
    fVar156 = 1.0 - fVar137;
    fVar168 = 1.0 - fVar138;
    fVar169 = 1.0 - fVar139;
    fVar182 = 1.0 - fVar154;
    fVar245 = local_268 * fVar156 + local_168 * fVar137;
    fVar262 = fStack_264 * fVar168 + fStack_164 * fVar138;
    fVar264 = fStack_260 * fVar169 + fStack_160 * fVar139;
    fVar266 = fStack_25c * fVar182 + fStack_15c * fVar154;
    fVar270 = local_278 * fVar156 + local_288 * fVar137;
    fVar271 = fStack_274 * fVar168 + fStack_284 * fVar138;
    fVar272 = fStack_270 * fVar169 + fStack_280 * fVar139;
    fVar251 = fStack_26c * fVar182 + fStack_27c * fVar154;
    fVar253 = local_458 * fVar156 + local_178 * fVar137;
    fVar261 = fStack_454 * fVar168 + fStack_174 * fVar138;
    fVar263 = fStack_450 * fVar169 + fStack_170 * fVar139;
    fVar265 = fStack_44c * fVar182 + fStack_16c * fVar154;
    fVar100 = local_468 * fVar156 + local_378 * fVar137;
    fVar249 = fStack_464 * fVar168 + fStack_374 * fVar138;
    fVar250 = fStack_460 * fVar169 + fStack_370 * fVar139;
    fVar252 = fStack_45c * fVar182 + fStack_36c * fVar154;
    fVar196 = (local_238 * fVar156 + local_268 * fVar137) * fVar156 + fVar137 * fVar245;
    fVar197 = (fStack_234 * fVar168 + fStack_264 * fVar138) * fVar168 + fVar138 * fVar262;
    fVar198 = (fStack_230 * fVar169 + fStack_260 * fVar139) * fVar169 + fVar139 * fVar264;
    fVar170 = (fStack_22c * fVar182 + fStack_25c * fVar154) * fVar182 + fVar154 * fVar266;
    fVar181 = (local_158 * fVar156 + local_278 * fVar137) * fVar156 + fVar137 * fVar270;
    fVar208 = (fStack_154 * fVar168 + fStack_274 * fVar138) * fVar168 + fVar138 * fVar271;
    fVar209 = (fStack_150 * fVar169 + fStack_270 * fVar139) * fVar169 + fVar139 * fVar272;
    fVar210 = (fStack_14c * fVar182 + fStack_26c * fVar154) * fVar182 + fVar154 * fVar251;
    fVar228 = (local_248 * fVar156 + local_458 * fVar137) * fVar156 + fVar137 * fVar253;
    fVar229 = (fStack_244 * fVar168 + fStack_454 * fVar138) * fVar168 + fVar138 * fVar261;
    fVar230 = (fStack_240 * fVar169 + fStack_450 * fVar139) * fVar169 + fVar139 * fVar263;
    fVar236 = (fStack_23c * fVar182 + fStack_44c * fVar154) * fVar182 + fVar154 * fVar265;
    fVar237 = (local_258 * fVar156 + local_468 * fVar137) * fVar156 + fVar137 * fVar100;
    fVar238 = (fStack_254 * fVar168 + fStack_464 * fVar138) * fVar168 + fVar138 * fVar249;
    fVar243 = (fStack_250 * fVar169 + fStack_460 * fVar139) * fVar169 + fVar139 * fVar250;
    fVar244 = (fStack_24c * fVar182 + fStack_45c * fVar154) * fVar182 + fVar154 * fVar252;
    fVar260 = fVar245 * fVar156 + (local_168 * fVar156 + local_188 * fVar137) * fVar137;
    fVar262 = fVar262 * fVar168 + (fStack_164 * fVar168 + fStack_184 * fVar138) * fVar138;
    fVar264 = fVar264 * fVar169 + (fStack_160 * fVar169 + fStack_180 * fVar139) * fVar139;
    fVar266 = fVar266 * fVar182 + (fStack_15c * fVar182 + fStack_17c * fVar154) * fVar154;
    fVar270 = fVar270 * fVar156 + (local_288 * fVar156 + local_198 * fVar137) * fVar137;
    fVar271 = fVar271 * fVar168 + (fStack_284 * fVar168 + fStack_194 * fVar138) * fVar138;
    fVar272 = fVar272 * fVar169 + (fStack_280 * fVar169 + fStack_190 * fVar139) * fVar139;
    fVar251 = fVar251 * fVar182 + (fStack_27c * fVar182 + fStack_18c * fVar154) * fVar154;
    fVar253 = fVar253 * fVar156 + (local_178 * fVar156 + local_1a8 * fVar137) * fVar137;
    fVar261 = fVar261 * fVar168 + (fStack_174 * fVar168 + fStack_1a4 * fVar138) * fVar138;
    fVar263 = fVar263 * fVar169 + (fStack_170 * fVar169 + fStack_1a0 * fVar139) * fVar139;
    fVar265 = fVar265 * fVar182 + (fStack_16c * fVar182 + fStack_19c * fVar154) * fVar154;
    fVar245 = fVar100 * fVar156 + (local_378 * fVar156 + local_1b8 * fVar137) * fVar137;
    fVar249 = fVar249 * fVar168 + (fStack_374 * fVar168 + fStack_1b4 * fVar138) * fVar138;
    fVar250 = fVar250 * fVar169 + (fStack_370 * fVar169 + fStack_1b0 * fVar139) * fVar139;
    fVar252 = fVar252 * fVar182 + (fStack_36c * fVar182 + fStack_1ac * fVar154) * fVar154;
    fVar273 = fVar156 * fVar196 + fVar137 * fVar260;
    fVar274 = fVar168 * fVar197 + fVar138 * fVar262;
    fVar275 = fVar169 * fVar198 + fVar139 * fVar264;
    fVar276 = fVar182 * fVar170 + fVar154 * fVar266;
    fVar277 = fVar156 * fVar181 + fVar137 * fVar270;
    fVar281 = fVar168 * fVar208 + fVar138 * fVar271;
    fVar282 = fVar169 * fVar209 + fVar139 * fVar272;
    fVar283 = fVar182 * fVar210 + fVar154 * fVar251;
    local_528 = fVar156 * fVar228 + fVar137 * fVar253;
    fStack_524 = fVar168 * fVar229 + fVar138 * fVar261;
    fStack_520 = fVar169 * fVar230 + fVar139 * fVar263;
    fStack_51c = fVar182 * fVar236 + fVar154 * fVar265;
    fVar100 = fVar180 * 0.11111111;
    fVar156 = fVar156 * fVar237 + fVar137 * fVar245;
    fVar168 = fVar168 * fVar238 + fVar138 * fVar249;
    auVar142._0_8_ = CONCAT44(fVar168,fVar156);
    auVar142._8_4_ = fVar169 * fVar243 + fVar139 * fVar250;
    auVar142._12_4_ = fVar182 * fVar244 + fVar154 * fVar252;
    fVar260 = (fVar260 - fVar196) * 3.0 * fVar100;
    local_4e8._0_4_ = (fVar262 - fVar197) * 3.0 * fVar100;
    local_4e8._4_4_ = (fVar264 - fVar198) * 3.0 * fVar100;
    fStack_4e0 = (fVar266 - fVar170) * 3.0 * fVar100;
    fVar262 = (fVar270 - fVar181) * 3.0 * fVar100;
    local_4c8 = (fVar271 - fVar208) * 3.0 * fVar100;
    fStack_4c4 = (fVar272 - fVar209) * 3.0 * fVar100;
    fStack_4c0 = (fVar251 - fVar210) * 3.0 * fVar100;
    local_4b8 = (fVar253 - fVar228) * 3.0 * fVar100;
    fStack_4b4 = (fVar261 - fVar229) * 3.0 * fVar100;
    fStack_4b0 = (fVar263 - fVar230) * 3.0 * fVar100;
    fStack_4ac = (fVar265 - fVar236) * 3.0 * fVar100;
    fVar137 = fVar100 * (fVar249 - fVar238) * 3.0;
    fVar138 = fVar100 * (fVar250 - fVar243) * 3.0;
    fVar139 = fVar100 * (fVar252 - fVar244) * 3.0;
    local_488._4_4_ = fVar275;
    local_488._0_4_ = fVar274;
    fStack_480 = fVar276;
    fStack_47c = 0.0;
    local_498._4_4_ = fVar282;
    local_498._0_4_ = fVar281;
    fStack_490 = fVar283;
    fStack_48c = 0.0;
    local_4a8._4_4_ = fStack_520;
    local_4a8._0_4_ = fStack_524;
    fStack_4a0 = fStack_51c;
    fStack_49c = 0.0;
    auVar111._4_4_ = auVar142._8_4_;
    auVar111._0_4_ = fVar168;
    auVar111._8_4_ = auVar142._12_4_;
    auVar111._12_4_ = 0;
    local_688._4_4_ = fVar168 + fVar137;
    local_688._0_4_ = fVar156 + fVar100 * (fVar245 - fVar237) * 3.0;
    fStack_680 = auVar142._8_4_ + fVar138;
    fStack_67c = auVar142._12_4_ + fVar139;
    auVar112._0_8_ = CONCAT44(auVar142._8_4_ - fVar138,fVar168 - fVar137);
    auVar112._8_4_ = auVar142._12_4_ - fVar139;
    auVar112._12_4_ = 0;
    local_3e8._0_4_ = fVar281 - fVar277;
    local_3e8._4_4_ = fVar282 - fVar281;
    fStack_3e0 = fVar283 - fVar282;
    fStack_3dc = 0.0 - fVar283;
    local_3f8._0_4_ = fStack_524 - local_528;
    local_3f8._4_4_ = fStack_520 - fStack_524;
    fStack_3f0 = fStack_51c - fStack_520;
    fStack_3ec = 0.0 - fStack_51c;
    fVar182 = fVar262 * (float)local_3f8._0_4_ - local_4b8 * (float)local_3e8._0_4_;
    fVar196 = local_4c8 * (float)local_3f8._4_4_ - fStack_4b4 * (float)local_3e8._4_4_;
    fVar197 = fStack_4c4 * fStack_3f0 - fStack_4b0 * fStack_3e0;
    fVar198 = fStack_4c0 * fStack_3ec - fStack_4ac * fStack_3dc;
    local_408 = fVar274 - fVar273;
    fStack_404 = fVar275 - fVar274;
    fStack_400 = fVar276 - fVar275;
    fStack_3fc = 0.0 - fVar276;
    fVar154 = local_4b8 * local_408 - fVar260 * (float)local_3f8._0_4_;
    fVar156 = fStack_4b4 * fStack_404 - (float)local_4e8._0_4_ * (float)local_3f8._4_4_;
    fVar168 = fStack_4b0 * fStack_400 - (float)local_4e8._4_4_ * fStack_3f0;
    fVar169 = fStack_4ac * fStack_3fc - fStack_4e0 * fStack_3ec;
    fVar170 = fVar260 * (float)local_3e8._0_4_ - fVar262 * local_408;
    fVar181 = (float)local_4e8._0_4_ * (float)local_3e8._4_4_ - local_4c8 * fStack_404;
    fVar208 = (float)local_4e8._4_4_ * fStack_3e0 - fStack_4c4 * fStack_400;
    fVar209 = fStack_4e0 * fStack_3dc - fStack_4c0 * fStack_3fc;
    auVar85._0_4_ = (float)local_3f8._0_4_ * (float)local_3f8._0_4_;
    auVar85._4_4_ = (float)local_3f8._4_4_ * (float)local_3f8._4_4_;
    auVar85._8_4_ = fStack_3f0 * fStack_3f0;
    auVar85._12_4_ = fStack_3ec * fStack_3ec;
    auVar225._0_4_ =
         local_408 * local_408 + (float)local_3e8._0_4_ * (float)local_3e8._0_4_ + auVar85._0_4_;
    auVar225._4_4_ =
         fStack_404 * fStack_404 + (float)local_3e8._4_4_ * (float)local_3e8._4_4_ + auVar85._4_4_;
    auVar225._8_4_ = fStack_400 * fStack_400 + fStack_3e0 * fStack_3e0 + auVar85._8_4_;
    auVar225._12_4_ = fStack_3fc * fStack_3fc + fStack_3dc * fStack_3dc + auVar85._12_4_;
    auVar70 = rcpps(auVar85,auVar225);
    fVar100 = auVar70._0_4_;
    fVar137 = auVar70._4_4_;
    fVar138 = auVar70._8_4_;
    fVar139 = auVar70._12_4_;
    fVar100 = (1.0 - fVar100 * auVar225._0_4_) * fVar100 + fVar100;
    fVar137 = (1.0 - fVar137 * auVar225._4_4_) * fVar137 + fVar137;
    fVar138 = (1.0 - fVar138 * auVar225._8_4_) * fVar138 + fVar138;
    fVar139 = (1.0 - fVar139 * auVar225._12_4_) * fVar139 + fVar139;
    fVar210 = (float)local_3f8._0_4_ * local_4c8 - (float)local_3e8._0_4_ * fStack_4b4;
    fVar228 = (float)local_3f8._4_4_ * fStack_4c4 - (float)local_3e8._4_4_ * fStack_4b0;
    fVar229 = fStack_3f0 * fStack_4c0 - fStack_3e0 * fStack_4ac;
    fVar230 = fStack_3ec * 0.0 - fStack_3dc * 0.0;
    local_4d8 = fStack_4b4;
    fStack_4d4 = fStack_4b0;
    fStack_4d0 = fStack_4ac;
    fStack_4cc = 0.0;
    fVar236 = local_408 * fStack_4b4 - (float)local_3f8._0_4_ * (float)local_4e8._0_4_;
    fVar237 = fStack_404 * fStack_4b0 - (float)local_3f8._4_4_ * (float)local_4e8._4_4_;
    fVar238 = fStack_400 * fStack_4ac - fStack_3f0 * fStack_4e0;
    fVar243 = fStack_3fc * 0.0 - fStack_3ec * 0.0;
    fStack_4bc = 0.0;
    uStack_4dc = 0;
    fVar244 = (float)local_3e8._0_4_ * (float)local_4e8._0_4_ - local_408 * local_4c8;
    fVar245 = (float)local_3e8._4_4_ * (float)local_4e8._4_4_ - fStack_404 * fStack_4c4;
    fVar249 = fStack_3e0 * fStack_4e0 - fStack_400 * fStack_4c0;
    fVar250 = fStack_3dc * 0.0 - fStack_3fc * 0.0;
    auVar204._0_4_ = (fVar182 * fVar182 + fVar154 * fVar154 + fVar170 * fVar170) * fVar100;
    auVar204._4_4_ = (fVar196 * fVar196 + fVar156 * fVar156 + fVar181 * fVar181) * fVar137;
    auVar204._8_4_ = (fVar197 * fVar197 + fVar168 * fVar168 + fVar208 * fVar208) * fVar138;
    auVar204._12_4_ = (fVar198 * fVar198 + fVar169 * fVar169 + fVar209 * fVar209) * fVar139;
    auVar232._0_4_ = (fVar210 * fVar210 + fVar236 * fVar236 + fVar244 * fVar244) * fVar100;
    auVar232._4_4_ = (fVar228 * fVar228 + fVar237 * fVar237 + fVar245 * fVar245) * fVar137;
    auVar232._8_4_ = (fVar229 * fVar229 + fVar238 * fVar238 + fVar249 * fVar249) * fVar138;
    auVar232._12_4_ = (fVar230 * fVar230 + fVar243 * fVar243 + fVar250 * fVar250) * fVar139;
    auVar205 = maxps(auVar204,auVar232);
    auVar188._8_4_ = auVar142._8_4_;
    auVar188._0_8_ = auVar142._0_8_;
    auVar188._12_4_ = auVar142._12_4_;
    auVar70 = maxps(auVar188,_local_688);
    auVar233._8_4_ = auVar112._8_4_;
    auVar233._0_8_ = auVar112._0_8_;
    auVar233._12_4_ = 0;
    auVar185 = maxps(auVar233,auVar111);
    auVar186 = maxps(auVar70,auVar185);
    auVar185 = minps(auVar142,_local_688);
    auVar70 = minps(auVar112,auVar111);
    auVar185 = minps(auVar185,auVar70);
    auVar70 = sqrtps(auVar70,auVar205);
    auVar143._0_4_ = auVar185._0_4_ - auVar70._0_4_;
    auVar143._4_4_ = auVar185._4_4_ - auVar70._4_4_;
    auVar143._8_4_ = auVar185._8_4_ - auVar70._8_4_;
    auVar143._12_4_ = auVar185._12_4_ - auVar70._12_4_;
    auVar185 = rsqrtps(auVar143,auVar225);
    fVar100 = auVar185._0_4_;
    fVar137 = auVar185._4_4_;
    fVar139 = auVar185._8_4_;
    fVar154 = auVar185._12_4_;
    fVar138 = fVar100 * fVar100 * auVar225._0_4_ * -0.5 * fVar100 + fVar100 * 1.5;
    fVar156 = fVar137 * fVar137 * auVar225._4_4_ * -0.5 * fVar137 + fVar137 * 1.5;
    fVar182 = fVar139 * fVar139 * auVar225._8_4_ * -0.5 * fVar139 + fVar139 * 1.5;
    fVar198 = fVar154 * fVar154 * auVar225._12_4_ * -0.5 * fVar154 + fVar154 * 1.5;
    fVar100 = 0.0 - fVar277;
    fVar139 = 0.0 - fVar281;
    fVar168 = 0.0 - fVar282;
    fVar196 = 0.0 - fVar283;
    fVar236 = 0.0 - local_528;
    fVar237 = 0.0 - fStack_524;
    fVar238 = 0.0 - fStack_520;
    fVar243 = 0.0 - fStack_51c;
    local_4f8 = 0.0 - fVar273;
    fStack_4f4 = 0.0 - fVar274;
    fStack_4f0 = 0.0 - fVar275;
    fStack_4ec = 0.0 - fVar276;
    fVar170 = local_448 * local_408 * fVar138 +
              (float)local_618._4_4_ * (float)local_3e8._0_4_ * fVar138 +
              local_548 * (float)local_3f8._0_4_ * fVar138;
    fVar181 = fStack_444 * fStack_404 * fVar156 +
              (float)local_618._4_4_ * (float)local_3e8._4_4_ * fVar156 +
              fStack_544 * (float)local_3f8._4_4_ * fVar156;
    fVar208 = fStack_440 * fStack_400 * fVar182 +
              (float)local_618._4_4_ * fStack_3e0 * fVar182 + fStack_540 * fStack_3f0 * fVar182;
    fVar209 = fStack_43c * fStack_3fc * fVar198 +
              (float)local_618._4_4_ * fStack_3dc * fVar198 + fStack_53c * fStack_3ec * fVar198;
    fStack_2a0 = fVar208;
    local_2a8 = CONCAT44(fVar181,fVar170);
    fStack_29c = fVar209;
    local_538 = local_408 * fVar138 * local_4f8 +
                (float)local_3e8._0_4_ * fVar138 * fVar100 +
                (float)local_3f8._0_4_ * fVar138 * fVar236;
    fStack_534 = fStack_404 * fVar156 * fStack_4f4 +
                 (float)local_3e8._4_4_ * fVar156 * fVar139 +
                 (float)local_3f8._4_4_ * fVar156 * fVar237;
    fStack_530 = fStack_400 * fVar182 * fStack_4f0 +
                 fStack_3e0 * fVar182 * fVar168 + fStack_3f0 * fVar182 * fVar238;
    fStack_52c = fStack_3fc * fVar198 * fStack_4ec +
                 fStack_3dc * fVar198 * fVar196 + fStack_3ec * fVar198 * fVar243;
    local_578 = (local_448 * local_4f8 + (float)local_618._4_4_ * fVar100 + local_548 * fVar236) -
                fVar170 * local_538;
    fStack_574 = (fStack_444 * fStack_4f4 + (float)local_618._4_4_ * fVar139 + fStack_544 * fVar237)
                 - fVar181 * fStack_534;
    fStack_570 = (fStack_440 * fStack_4f0 + (float)local_618._4_4_ * fVar168 + fStack_540 * fVar238)
                 - fVar208 * fStack_530;
    fStack_56c = (fStack_43c * fStack_4ec + (float)local_618._4_4_ * fVar196 + fStack_53c * fVar243)
                 - fVar209 * fStack_52c;
    fVar137 = (local_4f8 * local_4f8 + fVar100 * fVar100 + fVar236 * fVar236) -
              local_538 * local_538;
    fVar154 = (fStack_4f4 * fStack_4f4 + fVar139 * fVar139 + fVar237 * fVar237) -
              fStack_534 * fStack_534;
    fVar169 = (fStack_4f0 * fStack_4f0 + fVar168 * fVar168 + fVar238 * fVar238) -
              fStack_530 * fStack_530;
    fVar197 = (fStack_4ec * fStack_4ec + fVar196 * fVar196 + fVar243 * fVar243) -
              fStack_52c * fStack_52c;
    fVar210 = (auVar186._0_4_ + auVar70._0_4_) * 1.0000002;
    fVar228 = (auVar186._4_4_ + auVar70._4_4_) * 1.0000002;
    fVar229 = (auVar186._8_4_ + auVar70._8_4_) * 1.0000002;
    fVar230 = (auVar186._12_4_ + auVar70._12_4_) * 1.0000002;
    fVar210 = fVar137 - fVar210 * fVar210;
    fVar228 = fVar154 - fVar228 * fVar228;
    fVar229 = fVar169 - fVar229 * fVar229;
    fVar230 = fVar197 - fVar230 * fVar230;
    local_1c8 = fVar170 * fVar170;
    fStack_1c4 = fVar181 * fVar181;
    fStack_1c0 = fVar208 * fVar208;
    fStack_1bc = fVar209 * fVar209;
    local_298 = local_148 - local_1c8;
    fStack_294 = fStack_144 - fStack_1c4;
    fStack_290 = fStack_140 - fStack_1c0;
    fStack_28c = fStack_13c - fStack_1bc;
    local_578 = local_578 + local_578;
    fStack_574 = fStack_574 + fStack_574;
    fStack_570 = fStack_570 + fStack_570;
    fStack_56c = fStack_56c + fStack_56c;
    local_508._0_4_ = local_578 * local_578;
    local_508._4_4_ = fStack_574 * fStack_574;
    fStack_500 = fStack_570 * fStack_570;
    fStack_4fc = fStack_56c * fStack_56c;
    local_208 = local_298 * 4.0;
    fStack_204 = fStack_294 * 4.0;
    fStack_200 = fStack_290 * 4.0;
    fStack_1fc = fStack_28c * 4.0;
    auVar189._0_4_ = (float)local_508._0_4_ - local_208 * fVar210;
    auVar189._4_4_ = (float)local_508._4_4_ - fStack_204 * fVar228;
    auVar189._8_4_ = fStack_500 - fStack_200 * fVar229;
    auVar189._12_4_ = fStack_4fc - fStack_1fc * fVar230;
    local_688._4_4_ = auVar143._4_4_ * 0.99999976;
    local_688._0_4_ = auVar143._0_4_ * 0.99999976;
    fStack_680 = auVar143._8_4_ * 0.99999976;
    fStack_67c = auVar143._12_4_ * 0.99999976;
    auVar246._4_4_ = -(uint)(0.0 <= auVar189._4_4_);
    auVar246._0_4_ = -(uint)(0.0 <= auVar189._0_4_);
    auVar246._8_4_ = -(uint)(0.0 <= auVar189._8_4_);
    auVar246._12_4_ = -(uint)(0.0 <= auVar189._12_4_);
    uVar49 = (undefined4)((ulong)lVar44 >> 0x20);
    iVar42 = movmskps((int)lVar44,auVar246);
    if (iVar42 == 0) {
      iVar42 = 0;
      auVar114 = _DAT_01f7a9f0;
      auVar234 = _DAT_01f7aa00;
    }
    else {
      auVar185 = sqrtps(_local_618,auVar189);
      bVar9 = 0.0 <= auVar189._0_4_;
      uVar56 = -(uint)bVar9;
      bVar10 = 0.0 <= auVar189._4_4_;
      uVar57 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar189._8_4_;
      uVar58 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar189._12_4_;
      uVar59 = -(uint)bVar12;
      auVar113._0_4_ = local_298 + local_298;
      auVar113._4_4_ = fStack_294 + fStack_294;
      auVar113._8_4_ = fStack_290 + fStack_290;
      auVar113._12_4_ = fStack_28c + fStack_28c;
      auVar70 = rcpps(_local_2a8,auVar113);
      fVar244 = auVar70._0_4_;
      fVar245 = auVar70._4_4_;
      fVar249 = auVar70._8_4_;
      fVar250 = auVar70._12_4_;
      fVar244 = (1.0 - auVar113._0_4_ * fVar244) * fVar244 + fVar244;
      fVar245 = (1.0 - auVar113._4_4_ * fVar245) * fVar245 + fVar245;
      fVar249 = (1.0 - auVar113._8_4_ * fVar249) * fVar249 + fVar249;
      fVar250 = (1.0 - auVar113._12_4_ * fVar250) * fVar250 + fVar250;
      fVar252 = (-local_578 - auVar185._0_4_) * fVar244;
      fVar264 = (-fStack_574 - auVar185._4_4_) * fVar245;
      fVar266 = (-fStack_570 - auVar185._8_4_) * fVar249;
      fVar270 = (-fStack_56c - auVar185._12_4_) * fVar250;
      fVar244 = (auVar185._0_4_ - local_578) * fVar244;
      fVar245 = (auVar185._4_4_ - fStack_574) * fVar245;
      fVar249 = (auVar185._8_4_ - fStack_570) * fVar249;
      fVar250 = (auVar185._12_4_ - fStack_56c) * fVar250;
      local_228 = (fVar170 * fVar252 + local_538) * fVar138;
      fStack_224 = (fVar181 * fVar264 + fStack_534) * fVar156;
      fStack_220 = (fVar208 * fVar266 + fStack_530) * fVar182;
      fStack_21c = (fVar209 * fVar270 + fStack_52c) * fVar198;
      local_218 = (fVar170 * fVar244 + local_538) * fVar138;
      fStack_214 = (fVar181 * fVar245 + fStack_534) * fVar156;
      fStack_210 = (fVar208 * fVar249 + fStack_530) * fVar182;
      fStack_20c = (fVar209 * fVar250 + fStack_52c) * fVar198;
      auVar114._0_8_ = CONCAT44(~uVar57,~uVar56) & 0x7f8000007f800000;
      auVar114._8_4_ = ~uVar58 & 0x7f800000;
      auVar114._12_4_ = ~uVar59 & 0x7f800000;
      auVar13._4_4_ = (uint)fVar264 & uVar57;
      auVar13._0_4_ = (uint)fVar252 & uVar56;
      auVar13._8_4_ = (uint)fVar266 & uVar58;
      auVar13._12_4_ = (uint)fVar270 & uVar59;
      auVar114 = auVar114 | auVar13;
      auVar278._0_4_ = (uint)fVar244 & uVar56;
      auVar278._4_4_ = (uint)fVar245 & uVar57;
      auVar278._8_4_ = (uint)fVar249 & uVar58;
      auVar278._12_4_ = (uint)fVar250 & uVar59;
      auVar234._0_8_ = CONCAT44(~uVar57,~uVar56) & 0xff800000ff800000;
      auVar234._8_4_ = ~uVar58 & 0xff800000;
      auVar234._12_4_ = ~uVar59 & 0xff800000;
      auVar234 = auVar234 | auVar278;
      auVar258._0_8_ = CONCAT44(fStack_1c4,local_1c8) & 0x7fffffff7fffffff;
      auVar258._8_4_ = ABS(fStack_1c0);
      auVar258._12_4_ = ABS(fStack_1bc);
      auVar21._4_4_ = fStack_384;
      auVar21._0_4_ = local_388;
      auVar21._8_4_ = fStack_380;
      auVar21._12_4_ = fStack_37c;
      auVar70 = maxps(auVar21,auVar258);
      fVar170 = auVar70._0_4_ * 1.9073486e-06;
      fVar181 = auVar70._4_4_ * 1.9073486e-06;
      fVar208 = auVar70._8_4_ * 1.9073486e-06;
      fVar209 = auVar70._12_4_ * 1.9073486e-06;
      auVar279._0_4_ = -(uint)(ABS(local_298) < fVar170 && bVar9);
      auVar279._4_4_ = -(uint)(ABS(fStack_294) < fVar181 && bVar10);
      auVar279._8_4_ = -(uint)(ABS(fStack_290) < fVar208 && bVar11);
      auVar279._12_4_ = -(uint)(ABS(fStack_28c) < fVar209 && bVar12);
      iVar42 = movmskps(iVar42,auVar279);
      if (iVar42 != 0) {
        uVar56 = -(uint)(fVar210 <= 0.0);
        uVar57 = -(uint)(fVar228 <= 0.0);
        uVar58 = -(uint)(fVar229 <= 0.0);
        uVar59 = -(uint)(fVar230 <= 0.0);
        auVar285._0_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar279._0_4_;
        auVar285._4_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar279._4_4_;
        auVar285._8_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar279._8_4_;
        auVar285._12_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar279._12_4_;
        auVar153._0_4_ = ~auVar279._0_4_ & auVar114._0_4_;
        auVar153._4_4_ = ~auVar279._4_4_ & auVar114._4_4_;
        auVar153._8_4_ = ~auVar279._8_4_ & auVar114._8_4_;
        auVar153._12_4_ = ~auVar279._12_4_ & auVar114._12_4_;
        auVar114 = auVar153 | auVar285;
        auVar269._0_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar279._0_4_;
        auVar269._4_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar279._4_4_;
        auVar269._8_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar279._8_4_;
        auVar269._12_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar279._12_4_;
        auVar280._0_4_ = ~auVar279._0_4_ & auVar234._0_4_;
        auVar280._4_4_ = ~auVar279._4_4_ & auVar234._4_4_;
        auVar280._8_4_ = ~auVar279._8_4_ & auVar234._8_4_;
        auVar280._12_4_ = ~auVar279._12_4_ & auVar234._12_4_;
        auVar234 = auVar280 | auVar269;
        auVar246._0_4_ = -(uint)((fVar170 <= ABS(local_298) || fVar210 <= 0.0) && bVar9);
        auVar246._4_4_ = -(uint)((fVar181 <= ABS(fStack_294) || fVar228 <= 0.0) && bVar10);
        auVar246._8_4_ = -(uint)((fVar208 <= ABS(fStack_290) || fVar229 <= 0.0) && bVar11);
        auVar246._12_4_ = -(uint)((fVar209 <= ABS(fStack_28c) || fVar230 <= 0.0) && bVar12);
      }
    }
    auVar247._0_4_ = (auVar246._0_4_ << 0x1f) >> 0x1f;
    auVar247._4_4_ = (auVar246._4_4_ << 0x1f) >> 0x1f;
    auVar247._8_4_ = (auVar246._8_4_ << 0x1f) >> 0x1f;
    auVar247._12_4_ = (auVar246._12_4_ << 0x1f) >> 0x1f;
    auVar247 = auVar247 & local_1f8;
    iVar42 = movmskps(iVar42,auVar247);
    pauVar48 = (undefined1 (*) [16])CONCAT44(uVar49,iVar42);
    if (iVar42 != 0) {
      auVar70 = _local_2a8;
      fVar170 = *(float *)(ray + k * 4 + 0x80);
      auVar284._0_4_ = fVar170 - (float)local_3d8._0_4_;
      auVar284._4_4_ = auVar284._0_4_;
      auVar284._8_4_ = auVar284._0_4_;
      auVar284._12_4_ = auVar284._0_4_;
      auVar205 = minps(auVar284,auVar234);
      auVar25._4_4_ = fStack_1e4;
      auVar25._0_4_ = local_1e8;
      auVar25._8_4_ = fStack_1e0;
      auVar25._12_4_ = fStack_1dc;
      auVar186 = maxps(auVar25,auVar114);
      auVar115._0_4_ = fVar262 * (float)local_618._4_4_ + local_4b8 * local_548;
      auVar115._4_4_ = local_4c8 * (float)local_618._4_4_ + fStack_4b4 * fStack_544;
      auVar115._8_4_ = fStack_4c4 * (float)local_618._4_4_ + fStack_4b0 * fStack_540;
      auVar115._12_4_ = fStack_4c0 * (float)local_618._4_4_ + fStack_4ac * fStack_53c;
      auVar239._0_4_ = fVar260 * local_448 + auVar115._0_4_;
      auVar239._4_4_ = (float)local_4e8._0_4_ * fStack_444 + auVar115._4_4_;
      auVar239._8_4_ = (float)local_4e8._4_4_ * fStack_440 + auVar115._8_4_;
      auVar239._12_4_ = fStack_4e0 * fStack_43c + auVar115._12_4_;
      auVar185 = rcpps(auVar115,auVar239);
      fVar181 = auVar185._0_4_;
      fVar208 = auVar185._4_4_;
      fVar209 = auVar185._8_4_;
      fVar210 = auVar185._12_4_;
      fVar100 = ((1.0 - auVar239._0_4_ * fVar181) * fVar181 + fVar181) *
                -(local_4f8 * fVar260 + fVar100 * fVar262 + fVar236 * local_4b8);
      fVar139 = ((1.0 - auVar239._4_4_ * fVar208) * fVar208 + fVar208) *
                -(fStack_4f4 * (float)local_4e8._0_4_ + fVar139 * local_4c8 + fVar237 * fStack_4b4);
      fVar168 = ((1.0 - auVar239._8_4_ * fVar209) * fVar209 + fVar209) *
                -(fStack_4f0 * (float)local_4e8._4_4_ + fVar168 * fStack_4c4 + fVar238 * fStack_4b0)
      ;
      fVar196 = ((1.0 - auVar239._12_4_ * fVar210) * fVar210 + fVar210) *
                -(fStack_4ec * fStack_4e0 + fVar196 * fStack_4c0 + fVar243 * fStack_4ac);
      uVar56 = -(uint)(auVar239._0_4_ < 0.0 || ABS(auVar239._0_4_) < 1e-18);
      uVar57 = -(uint)(auVar239._4_4_ < 0.0 || ABS(auVar239._4_4_) < 1e-18);
      uVar58 = -(uint)(auVar239._8_4_ < 0.0 || ABS(auVar239._8_4_) < 1e-18);
      uVar59 = -(uint)(auVar239._12_4_ < 0.0 || ABS(auVar239._12_4_) < 1e-18);
      auVar158._0_8_ = CONCAT44(uVar57,uVar56) & 0xff800000ff800000;
      auVar158._8_4_ = uVar58 & 0xff800000;
      auVar158._12_4_ = uVar59 & 0xff800000;
      auVar116._0_4_ = ~uVar56 & (uint)fVar100;
      auVar116._4_4_ = ~uVar57 & (uint)fVar139;
      auVar116._8_4_ = ~uVar58 & (uint)fVar168;
      auVar116._12_4_ = ~uVar59 & (uint)fVar196;
      auVar186 = maxps(auVar186,auVar116 | auVar158);
      uVar56 = -(uint)(0.0 < auVar239._0_4_ || ABS(auVar239._0_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar239._4_4_ || ABS(auVar239._4_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar239._8_4_ || ABS(auVar239._8_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar239._12_4_ || ABS(auVar239._12_4_) < 1e-18);
      auVar117._0_8_ = CONCAT44(uVar57,uVar56) & 0x7f8000007f800000;
      auVar117._8_4_ = uVar58 & 0x7f800000;
      auVar117._12_4_ = uVar59 & 0x7f800000;
      auVar240._0_4_ = ~uVar56 & (uint)fVar100;
      auVar240._4_4_ = ~uVar57 & (uint)fVar139;
      auVar240._8_4_ = ~uVar58 & (uint)fVar168;
      auVar240._12_4_ = ~uVar59 & (uint)fVar196;
      auVar205 = minps(auVar205,auVar240 | auVar117);
      auVar159._0_4_ = (0.0 - fVar281) * -local_4c8 + (0.0 - fStack_524) * -fStack_4b4;
      auVar159._4_4_ = (0.0 - fVar282) * -fStack_4c4 + (0.0 - fStack_520) * -fStack_4b0;
      auVar159._8_4_ = (0.0 - fVar283) * -fStack_4c0 + (0.0 - fStack_51c) * -fStack_4ac;
      auVar159._12_4_ = 0x80000000;
      auVar173._0_4_ =
           -(float)local_4e8._0_4_ * local_448 +
           -local_4c8 * (float)local_618._4_4_ + -fStack_4b4 * local_548;
      auVar173._4_4_ =
           -(float)local_4e8._4_4_ * fStack_444 +
           -fStack_4c4 * (float)local_618._4_4_ + -fStack_4b0 * fStack_544;
      auVar173._8_4_ =
           -fStack_4e0 * fStack_440 +
           -fStack_4c0 * (float)local_618._4_4_ + -fStack_4ac * fStack_540;
      auVar173._12_4_ = fStack_43c * -0.0 + (float)local_618._4_4_ * -0.0 + fStack_53c * -0.0;
      auVar185 = rcpps(auVar159,auVar173);
      fVar100 = auVar185._0_4_;
      fVar139 = auVar185._4_4_;
      fVar168 = auVar185._8_4_;
      fVar196 = auVar185._12_4_;
      fVar100 = (((float)DAT_01f7ba10 - auVar173._0_4_ * fVar100) * fVar100 + fVar100) *
                -((0.0 - fVar274) * -(float)local_4e8._0_4_ + auVar159._0_4_);
      fVar139 = ((DAT_01f7ba10._4_4_ - auVar173._4_4_ * fVar139) * fVar139 + fVar139) *
                -((0.0 - fVar275) * -(float)local_4e8._4_4_ + auVar159._4_4_);
      fVar168 = ((DAT_01f7ba10._8_4_ - auVar173._8_4_ * fVar168) * fVar168 + fVar168) *
                -((0.0 - fVar276) * -fStack_4e0 + auVar159._8_4_);
      fVar196 = ((DAT_01f7ba10._12_4_ - auVar173._12_4_ * fVar196) * fVar196 + fVar196) * 0.0;
      uVar56 = -(uint)(auVar173._0_4_ < 0.0 || ABS(auVar173._0_4_) < 1e-18);
      uVar57 = -(uint)(auVar173._4_4_ < 0.0 || ABS(auVar173._4_4_) < 1e-18);
      uVar58 = -(uint)(auVar173._8_4_ < 0.0 || ABS(auVar173._8_4_) < 1e-18);
      uVar59 = -(uint)(auVar173._12_4_ < 0.0 || ABS(auVar173._12_4_) < 1e-18);
      auVar160._0_8_ = CONCAT44(uVar57,uVar56) & 0xff800000ff800000;
      auVar160._8_4_ = uVar58 & 0xff800000;
      auVar160._12_4_ = uVar59 & 0xff800000;
      auVar118._0_4_ = ~uVar56 & (uint)fVar100;
      auVar118._4_4_ = ~uVar57 & (uint)fVar139;
      auVar118._8_4_ = ~uVar58 & (uint)fVar168;
      auVar118._12_4_ = ~uVar59 & (uint)fVar196;
      auVar185 = maxps(auVar186,auVar118 | auVar160);
      uVar56 = -(uint)(0.0 < auVar173._0_4_ || ABS(auVar173._0_4_) < 1e-18);
      uVar57 = -(uint)(0.0 < auVar173._4_4_ || ABS(auVar173._4_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar173._8_4_ || ABS(auVar173._8_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar173._12_4_ || ABS(auVar173._12_4_) < 1e-18);
      auVar119._0_8_ = CONCAT44(uVar57,uVar56) & 0x7f8000007f800000;
      auVar119._8_4_ = uVar58 & 0x7f800000;
      auVar119._12_4_ = uVar59 & 0x7f800000;
      auVar174._0_4_ = ~uVar56 & (uint)fVar100;
      auVar174._4_4_ = ~uVar57 & (uint)fVar139;
      auVar174._8_4_ = ~uVar58 & (uint)fVar168;
      auVar174._12_4_ = ~uVar59 & (uint)fVar196;
      local_2c8 = minps(auVar205,auVar174 | auVar119);
      fVar100 = auVar185._12_4_;
      fVar139 = auVar185._0_4_;
      fVar168 = auVar185._4_4_;
      fVar196 = auVar185._8_4_;
      local_5c8._0_4_ = auVar247._0_4_;
      local_5c8._4_4_ = auVar247._4_4_;
      uStack_5c0 = auVar247._8_4_;
      uStack_5bc = auVar247._12_4_;
      auVar259._0_8_ =
           CONCAT44(-(uint)(fVar168 <= local_2c8._4_4_) & local_5c8._4_4_,
                    -(uint)(fVar139 <= local_2c8._0_4_) & (uint)local_5c8);
      auVar259._8_4_ = -(uint)(fVar196 <= local_2c8._8_4_) & uStack_5c0;
      auVar259._12_4_ = -(uint)(fVar100 <= local_2c8._12_4_) & uStack_5bc;
      iVar42 = movmskps(iVar42,auVar259);
      pauVar48 = (undefined1 (*) [16])CONCAT44(uVar49,iVar42);
      if (iVar42 != 0) {
        auVar205 = maxps(ZEXT816(0),_local_688);
        auVar23._4_4_ = fStack_224;
        auVar23._0_4_ = local_228;
        auVar23._8_4_ = fStack_220;
        auVar23._12_4_ = fStack_21c;
        auVar186 = minps(auVar23,_DAT_01f7ba10);
        auVar226 = maxps(auVar186,ZEXT816(0));
        auVar24._4_4_ = fStack_214;
        auVar24._0_4_ = local_218;
        auVar24._8_4_ = fStack_210;
        auVar24._12_4_ = fStack_20c;
        auVar186 = minps(auVar24,_DAT_01f7ba10);
        auVar186 = maxps(auVar186,ZEXT816(0));
        local_108._0_4_ = (auVar226._0_4_ + 0.0) * 0.25 * fVar180 + local_1d8;
        local_108._4_4_ = (auVar226._4_4_ + 1.0) * 0.25 * fVar180 + local_1d8;
        local_108._8_4_ = (auVar226._8_4_ + 2.0) * 0.25 * fVar180 + local_1d8;
        local_108._12_4_ = (auVar226._12_4_ + 3.0) * 0.25 * fVar180 + local_1d8;
        auVar144._0_12_ = ZEXT812(0);
        auVar144._12_4_ = 0;
        local_118[0] = (auVar186._0_4_ + 0.0) * 0.25 * fVar180 + local_1d8;
        local_118[1] = (auVar186._4_4_ + 1.0) * 0.25 * fVar180 + local_1d8;
        local_118[2] = (auVar186._8_4_ + 2.0) * 0.25 * fVar180 + local_1d8;
        local_118[3] = (auVar186._12_4_ + 3.0) * 0.25 * fVar180 + local_1d8;
        fVar137 = fVar137 - auVar205._0_4_ * auVar205._0_4_;
        fVar154 = fVar154 - auVar205._4_4_ * auVar205._4_4_;
        fVar169 = fVar169 - auVar205._8_4_ * auVar205._8_4_;
        fVar197 = fVar197 - auVar205._12_4_ * auVar205._12_4_;
        auVar86._0_4_ = (float)local_508._0_4_ - local_208 * fVar137;
        auVar86._4_4_ = (float)local_508._4_4_ - fStack_204 * fVar154;
        auVar86._8_4_ = fStack_500 - fStack_200 * fVar169;
        auVar86._12_4_ = fStack_4fc - fStack_1fc * fVar197;
        local_508._4_4_ = -(uint)(0.0 <= auVar86._4_4_);
        local_508._0_4_ = -(uint)(0.0 <= auVar86._0_4_);
        fStack_500 = (float)-(uint)(0.0 <= auVar86._8_4_);
        fStack_4fc = (float)-(uint)(0.0 <= auVar86._12_4_);
        iVar42 = movmskps(iVar42,_local_508);
        auVar248._4_4_ = fVar102;
        auVar248._0_4_ = fVar101;
        auVar248._8_4_ = fVar103;
        auVar248._12_4_ = fVar104;
        if (iVar42 == 0) {
          _local_628 = ZEXT816(0);
          fVar180 = 0.0;
          fVar181 = 0.0;
          fVar208 = 0.0;
          fVar209 = 0.0;
          fVar138 = 0.0;
          fVar156 = 0.0;
          fVar182 = 0.0;
          fVar198 = 0.0;
          fVar236 = 0.0;
          fVar237 = 0.0;
          fVar238 = 0.0;
          fVar243 = 0.0;
          fVar210 = 0.0;
          fVar228 = 0.0;
          fVar229 = 0.0;
          fVar230 = 0.0;
          _local_568 = ZEXT816(0);
          iVar42 = 0;
          auVar87 = _DAT_01f7a9f0;
          auVar207 = _DAT_01f7aa00;
        }
        else {
          auVar205 = sqrtps(local_108,auVar86);
          auVar120._0_4_ = local_298 + local_298;
          auVar120._4_4_ = fStack_294 + fStack_294;
          auVar120._8_4_ = fStack_290 + fStack_290;
          auVar120._12_4_ = fStack_28c + fStack_28c;
          auVar186 = rcpps(auVar144,auVar120);
          fVar244 = auVar186._0_4_;
          fVar245 = auVar186._4_4_;
          fVar249 = auVar186._8_4_;
          fVar250 = auVar186._12_4_;
          fVar244 = ((float)DAT_01f7ba10 - auVar120._0_4_ * fVar244) * fVar244 + fVar244;
          fVar245 = (DAT_01f7ba10._4_4_ - auVar120._4_4_ * fVar245) * fVar245 + fVar245;
          fVar249 = (DAT_01f7ba10._8_4_ - auVar120._8_4_ * fVar249) * fVar249 + fVar249;
          fVar250 = (DAT_01f7ba10._12_4_ - auVar120._12_4_ * fVar250) * fVar250 + fVar250;
          fVar252 = (-local_578 - auVar205._0_4_) * fVar244;
          fVar260 = (-fStack_574 - auVar205._4_4_) * fVar245;
          fVar262 = (-fStack_570 - auVar205._8_4_) * fVar249;
          fVar264 = (-fStack_56c - auVar205._12_4_) * fVar250;
          fVar244 = (auVar205._0_4_ - local_578) * fVar244;
          fVar245 = (auVar205._4_4_ - fStack_574) * fVar245;
          fVar249 = (auVar205._8_4_ - fStack_570) * fVar249;
          fVar250 = (auVar205._12_4_ - fStack_56c) * fVar250;
          fVar180 = ((float)local_2a8._0_4_ * fVar252 + local_538) * fVar138;
          fVar181 = ((float)local_2a8._4_4_ * fVar260 + fStack_534) * fVar156;
          fVar208 = (fStack_2a0 * fVar262 + fStack_530) * fVar182;
          fVar209 = (fStack_29c * fVar264 + fStack_52c) * fVar198;
          fVar236 = local_448 * fVar252 - (local_408 * fVar180 + fVar273);
          fVar237 = fStack_444 * fVar260 - (fStack_404 * fVar181 + fVar274);
          fVar238 = fStack_440 * fVar262 - (fStack_400 * fVar208 + fVar275);
          fVar243 = fStack_43c * fVar264 - (fStack_3fc * fVar209 + fVar276);
          fVar210 = (float)local_618._4_4_ * fVar252 - ((float)local_3e8._0_4_ * fVar180 + fVar277);
          fVar228 = (float)local_618._4_4_ * fVar260 - ((float)local_3e8._4_4_ * fVar181 + fVar281);
          fVar229 = (float)local_618._4_4_ * fVar262 - (fStack_3e0 * fVar208 + fVar282);
          fVar230 = (float)local_618._4_4_ * fVar264 - (fStack_3dc * fVar209 + fVar283);
          local_568._4_4_ = fStack_544 * fVar260 - (fVar181 * (float)local_3f8._4_4_ + fStack_524);
          local_568._0_4_ = local_548 * fVar252 - (fVar180 * (float)local_3f8._0_4_ + local_528);
          fStack_560 = fStack_540 * fVar262 - (fVar208 * fStack_3f0 + fStack_520);
          fStack_55c = fStack_53c * fVar264 - (fVar209 * fStack_3ec + fStack_51c);
          fVar138 = ((float)local_2a8._0_4_ * fVar244 + local_538) * fVar138;
          fVar156 = ((float)local_2a8._4_4_ * fVar245 + fStack_534) * fVar156;
          fVar182 = (fStack_2a0 * fVar249 + fStack_530) * fVar182;
          fVar198 = (fStack_29c * fVar250 + fStack_52c) * fVar198;
          local_628._4_4_ = fStack_444 * fVar245 - (fStack_404 * fVar156 + fVar274);
          local_628._0_4_ = local_448 * fVar244 - (local_408 * fVar138 + fVar273);
          fStack_620 = fStack_440 * fVar249 - (fStack_400 * fVar182 + fVar275);
          fStack_61c = fStack_43c * fVar250 - (fStack_3fc * fVar198 + fVar276);
          fVar180 = (float)local_618._4_4_ * fVar244 - ((float)local_3e8._0_4_ * fVar138 + fVar277);
          fVar181 = (float)local_618._4_4_ * fVar245 - ((float)local_3e8._4_4_ * fVar156 + fVar281);
          fVar208 = (float)local_618._4_4_ * fVar249 - (fStack_3e0 * fVar182 + fVar282);
          fVar209 = (float)local_618._4_4_ * fVar250 - (fStack_3dc * fVar198 + fVar283);
          bVar9 = 0.0 <= auVar86._0_4_;
          uVar56 = -(uint)bVar9;
          bVar10 = 0.0 <= auVar86._4_4_;
          uVar57 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar86._8_4_;
          uVar58 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar86._12_4_;
          uVar59 = -(uint)bVar12;
          fVar138 = local_548 * fVar244 - (fVar138 * (float)local_3f8._0_4_ + local_528);
          fVar156 = fStack_544 * fVar245 - (fVar156 * (float)local_3f8._4_4_ + fStack_524);
          fVar182 = fStack_540 * fVar249 - (fVar182 * fStack_3f0 + fStack_520);
          fVar198 = fStack_53c * fVar250 - (fVar198 * fStack_3ec + fStack_51c);
          auVar206._0_4_ = (uint)fVar252 & uVar56;
          auVar206._4_4_ = (uint)fVar260 & uVar57;
          auVar206._8_4_ = (uint)fVar262 & uVar58;
          auVar206._12_4_ = (uint)fVar264 & uVar59;
          auVar87._0_8_ = CONCAT44(~uVar57,~uVar56) & 0x7f8000007f800000;
          auVar87._8_4_ = ~uVar58 & 0x7f800000;
          auVar87._12_4_ = ~uVar59 & 0x7f800000;
          auVar87 = auVar87 | auVar206;
          auVar227._0_4_ = (uint)fVar244 & uVar56;
          auVar227._4_4_ = (uint)fVar245 & uVar57;
          auVar227._8_4_ = (uint)fVar249 & uVar58;
          auVar227._12_4_ = (uint)fVar250 & uVar59;
          auVar207._0_8_ = CONCAT44(~uVar57,~uVar56) & 0xff800000ff800000;
          auVar207._8_4_ = ~uVar58 & 0xff800000;
          auVar207._12_4_ = ~uVar59 & 0xff800000;
          auVar207 = auVar207 | auVar227;
          auVar121._0_8_ = CONCAT44(fStack_1c4,local_1c8) & 0x7fffffff7fffffff;
          auVar121._8_4_ = ABS(fStack_1c0);
          auVar121._12_4_ = ABS(fStack_1bc);
          auVar22._4_4_ = fStack_384;
          auVar22._0_4_ = local_388;
          auVar22._8_4_ = fStack_380;
          auVar22._12_4_ = fStack_37c;
          auVar186 = maxps(auVar22,auVar121);
          fVar244 = auVar186._0_4_ * 1.9073486e-06;
          fVar245 = auVar186._4_4_ * 1.9073486e-06;
          fVar249 = auVar186._8_4_ * 1.9073486e-06;
          fVar250 = auVar186._12_4_ * 1.9073486e-06;
          auVar190._0_4_ = -(uint)(ABS(local_298) < fVar244 && bVar9);
          auVar190._4_4_ = -(uint)(ABS(fStack_294) < fVar245 && bVar10);
          auVar190._8_4_ = -(uint)(ABS(fStack_290) < fVar249 && bVar11);
          auVar190._12_4_ = -(uint)(ABS(fStack_28c) < fVar250 && bVar12);
          iVar42 = movmskps(iVar42,auVar190);
          if (iVar42 != 0) {
            uVar56 = -(uint)(fVar137 <= 0.0);
            uVar57 = -(uint)(fVar154 <= 0.0);
            uVar58 = -(uint)(fVar169 <= 0.0);
            uVar59 = -(uint)(fVar197 <= 0.0);
            auVar241._0_4_ = (uVar56 & 0xff800000 | ~uVar56 & 0x7f800000) & auVar190._0_4_;
            auVar241._4_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar190._4_4_;
            auVar241._8_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar190._8_4_;
            auVar241._12_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar190._12_4_;
            auVar235._0_4_ = ~auVar190._0_4_ & auVar87._0_4_;
            auVar235._4_4_ = ~auVar190._4_4_ & auVar87._4_4_;
            auVar235._8_4_ = ~auVar190._8_4_ & auVar87._8_4_;
            auVar235._12_4_ = ~auVar190._12_4_ & auVar87._12_4_;
            auVar87 = auVar235 | auVar241;
            auVar242._0_4_ = (uVar56 & 0x7f800000 | ~uVar56 & 0xff800000) & auVar190._0_4_;
            auVar242._4_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar190._4_4_;
            auVar242._8_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar190._8_4_;
            auVar242._12_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar190._12_4_;
            auVar195._0_4_ = ~auVar190._0_4_ & auVar207._0_4_;
            auVar195._4_4_ = ~auVar190._4_4_ & auVar207._4_4_;
            auVar195._8_4_ = ~auVar190._8_4_ & auVar207._8_4_;
            auVar195._12_4_ = ~auVar190._12_4_ & auVar207._12_4_;
            auVar207 = auVar195 | auVar242;
            local_508._4_4_ = -(uint)((fVar245 <= ABS(fStack_294) || fVar154 <= 0.0) && bVar10);
            local_508._0_4_ = -(uint)((fVar244 <= ABS(local_298) || fVar137 <= 0.0) && bVar9);
            fStack_500 = (float)-(uint)((fVar249 <= ABS(fStack_290) || fVar169 <= 0.0) && bVar11);
            fStack_4fc = (float)-(uint)((fVar250 <= ABS(fStack_28c) || fVar197 <= 0.0) && bVar12);
          }
        }
        fVar138 = fVar138 * local_548;
        fVar156 = fVar156 * fStack_544;
        fVar182 = fVar182 * fStack_540;
        fVar198 = fVar198 * fStack_53c;
        fVar137 = (float)local_628._0_4_ * local_448;
        fVar154 = (float)local_628._4_4_ * fStack_444;
        fStack_620 = fStack_620 * fStack_440;
        fStack_61c = fStack_61c * fStack_43c;
        _local_138 = auVar185;
        local_128 = minps(local_2c8,auVar87);
        auVar186 = maxps(auVar185,auVar207);
        local_2d8 = auVar186;
        local_3e8._0_4_ = -(uint)(fVar139 <= local_128._0_4_) & auVar259._0_4_;
        local_3e8._4_4_ = -(uint)(fVar168 <= local_128._4_4_) & auVar259._4_4_;
        fStack_3e0 = (float)(-(uint)(fVar196 <= local_128._8_4_) & auVar259._8_4_);
        fStack_3dc = (float)(-(uint)(fVar100 <= local_128._12_4_) & auVar259._12_4_);
        local_3f8 = (undefined1  [8])
                    CONCAT44(-(uint)(auVar186._4_4_ <= local_2c8._4_4_) & auVar259._4_4_,
                             -(uint)(auVar186._0_4_ <= local_2c8._0_4_) & auVar259._0_4_);
        fStack_3f0 = (float)(-(uint)(auVar186._8_4_ <= local_2c8._8_4_) & auVar259._8_4_);
        fStack_3ec = (float)(-(uint)(auVar186._12_4_ <= local_2c8._12_4_) & auVar259._12_4_);
        auVar88._8_4_ = fStack_3f0;
        auVar88._0_8_ = local_3f8;
        auVar88._12_4_ = fStack_3ec;
        iVar42 = movmskps(iVar42,auVar88 | _local_3e8);
        pauVar48 = (undefined1 (*) [16])CONCAT44(uVar49,iVar42);
        if (iVar42 != 0) {
          local_578 = fVar155;
          local_408 = (float)iVar50;
          fStack_404 = (float)iVar50;
          fStack_400 = (float)iVar50;
          fStack_3fc = (float)iVar50;
          local_568._0_4_ =
               -(uint)(iVar50 < ((int)((-(uint)(0.3 <= ABS((float)local_568._0_4_ * local_548 +
                                                           fVar210 * (float)local_618._4_4_ +
                                                           fVar236 * local_448)) & local_508._0_4_)
                                      << 0x1f) >> 0x1f) + 4);
          local_568._4_4_ =
               -(uint)(iVar50 < ((int)((-(uint)(0.3 <= ABS((float)local_568._4_4_ * fStack_544 +
                                                           fVar228 * (float)local_618._4_4_ +
                                                           fVar237 * fStack_444)) & local_508._4_4_)
                                      << 0x1f) >> 0x1f) + 4);
          fStack_560 = (float)-(uint)(iVar50 < ((int)((-(uint)(0.3 <= ABS(fStack_560 * fStack_540 +
                                                                          fVar229 * (float)local_618
                                                  ._4_4_ + fVar238 * fStack_440)) & (uint)fStack_500
                                                  ) << 0x1f) >> 0x1f) + 4);
          fStack_55c = (float)-(uint)(iVar50 < ((int)((-(uint)(0.3 <= ABS(fStack_55c * fStack_53c +
                                                                          fVar230 * (float)local_618
                                                  ._4_4_ + fVar243 * fStack_43c)) & (uint)fStack_4fc
                                                  ) << 0x1f) >> 0x1f) + 4);
          local_3b8 = ~_local_568 & _local_3e8;
          iVar42 = movmskps(iVar42,local_3b8);
          _local_2a8 = auVar70;
          if (iVar42 != 0) {
            local_538 = local_558 + fVar139;
            fStack_534 = fStack_554 + fVar168;
            fStack_530 = fStack_550 + fVar196;
            fStack_52c = fStack_54c + fVar100;
            do {
              auVar205 = ~local_3b8 & _DAT_01f7a9f0 | local_3b8 & auVar185;
              auVar161._4_4_ = auVar205._0_4_;
              auVar161._0_4_ = auVar205._4_4_;
              auVar161._8_4_ = auVar205._12_4_;
              auVar161._12_4_ = auVar205._8_4_;
              auVar70 = minps(auVar161,auVar205);
              auVar122._0_8_ = auVar70._8_8_;
              auVar122._8_4_ = auVar70._0_4_;
              auVar122._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar122,auVar70);
              auVar123._0_8_ =
                   CONCAT44(-(uint)(auVar70._4_4_ == auVar205._4_4_) & local_3b8._4_4_,
                            -(uint)(auVar70._0_4_ == auVar205._0_4_) & local_3b8._0_4_);
              auVar123._8_4_ = -(uint)(auVar70._8_4_ == auVar205._8_4_) & local_3b8._8_4_;
              auVar123._12_4_ = -(uint)(auVar70._12_4_ == auVar205._12_4_) & local_3b8._12_4_;
              iVar42 = movmskps(iVar42,auVar123);
              auVar89 = local_3b8;
              if (iVar42 != 0) {
                auVar89._8_4_ = auVar123._8_4_;
                auVar89._0_8_ = auVar123._0_8_;
                auVar89._12_4_ = auVar123._12_4_;
              }
              uVar43 = movmskps(iVar42,auVar89);
              uVar45 = 0;
              if (CONCAT44(uVar49,uVar43) != 0) {
                for (; (CONCAT44(uVar49,uVar43) >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              *(undefined4 *)(local_3b8 + uVar45 * 4) = 0;
              auVar19._4_4_ = fStack_414;
              auVar19._0_4_ = local_418;
              auVar19._8_4_ = fStack_410;
              auVar19._12_4_ = fStack_40c;
              auVar205 = minps(auVar248,auVar19);
              auVar226 = maxps(auVar248,auVar19);
              auVar17._4_4_ = fStack_424;
              auVar17._0_4_ = local_428;
              auVar17._8_4_ = fStack_420;
              auVar17._12_4_ = fStack_41c;
              auVar15._4_4_ = fStack_434;
              auVar15._0_4_ = local_438;
              auVar15._8_4_ = fStack_430;
              auVar15._12_4_ = fStack_42c;
              auVar70 = minps(auVar17,auVar15);
              auVar205 = minps(auVar205,auVar70);
              auVar70 = maxps(auVar17,auVar15);
              auVar70 = maxps(auVar226,auVar70);
              auVar145._0_8_ = auVar205._0_8_ & 0x7fffffff7fffffff;
              auVar145._8_4_ = auVar205._8_4_ & 0x7fffffff;
              auVar145._12_4_ = auVar205._12_4_ & 0x7fffffff;
              local_4f8 = auVar70._12_4_;
              auVar90._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
              auVar90._8_4_ = auVar70._8_4_ & 0x7fffffff;
              auVar90._12_4_ = ABS(local_4f8);
              auVar70 = maxps(auVar145,auVar90);
              fVar155 = auVar70._4_4_;
              if (auVar70._4_4_ <= auVar70._0_4_) {
                fVar155 = auVar70._0_4_;
              }
              auVar146._8_8_ = auVar70._8_8_;
              auVar146._0_8_ = auVar70._8_8_;
              if (auVar70._8_4_ <= fVar155) {
                auVar146._0_4_ = fVar155;
              }
              register0x00001284 = auVar146._4_12_;
              local_488._0_4_ = auVar146._0_4_ * 1.9073486e-06;
              fStack_4f4 = local_4f8;
              fStack_4f0 = local_4f8;
              fStack_4ec = local_4f8;
              fVar155 = *(float *)(local_108 + uVar45 * 4);
              fVar100 = *(float *)(local_138 + uVar45 * 4);
              lVar44 = 5;
              do {
                fVar229 = SQRT(fVar62) * 1.9073486e-06 * fVar100;
                fVar139 = 1.0 - fVar155;
                fVar168 = local_418 * fVar139 + local_428 * fVar155;
                fVar169 = fStack_414 * fVar139 + fStack_424 * fVar155;
                fVar196 = fStack_410 * fVar139 + fStack_420 * fVar155;
                fVar170 = fStack_40c * fVar139 + fStack_41c * fVar155;
                fVar236 = (fVar101 * fVar139 + local_418 * fVar155) * fVar139 + fVar155 * fVar168;
                fVar238 = (fVar102 * fVar139 + fStack_414 * fVar155) * fVar139 + fVar155 * fVar169;
                fVar243 = (fVar103 * fVar139 + fStack_410 * fVar155) * fVar139 + fVar155 * fVar196;
                fVar197 = (fVar104 * fVar139 + fStack_40c * fVar155) * fVar139 + fVar155 * fVar170;
                fVar249 = fVar168 * fVar139 + (local_428 * fVar139 + local_438 * fVar155) * fVar155;
                fVar250 = fVar169 * fVar139 +
                          (fStack_424 * fVar139 + fStack_434 * fVar155) * fVar155;
                fVar252 = fVar196 * fVar139 +
                          (fStack_420 * fVar139 + fStack_430 * fVar155) * fVar155;
                fVar170 = fVar170 * fVar139 +
                          (fStack_41c * fVar139 + fStack_42c * fVar155) * fVar155;
                fVar245 = fVar139 * fVar197 + fVar155 * fVar170;
                fVar168 = (fVar249 - fVar236) * 3.0;
                fVar169 = (fVar250 - fVar238) * 3.0;
                fVar196 = (fVar252 - fVar243) * 3.0;
                fVar197 = (fVar170 - fVar197) * 3.0;
                fVar170 = fVar139 * 6.0;
                fVar237 = (fVar155 - (fVar139 + fVar139)) * 6.0;
                fVar244 = (fVar139 - (fVar155 + fVar155)) * 6.0;
                fVar230 = fVar155 * 6.0;
                fVar210 = fVar170 * fVar101 +
                          fVar237 * local_418 + fVar244 * local_428 + fVar230 * local_438;
                fVar228 = fVar170 * fVar102 +
                          fVar237 * fStack_414 + fVar244 * fStack_424 + fVar230 * fStack_434;
                fVar170 = fVar170 * fVar103 +
                          fVar237 * fStack_410 + fVar244 * fStack_420 + fVar230 * fStack_430;
                local_4a8._0_4_ =
                     (fVar100 * (float)local_518._0_4_ + 0.0) -
                     (fVar139 * fVar236 + fVar155 * fVar249);
                local_4a8._4_4_ =
                     (fVar100 * (float)local_518._4_4_ + 0.0) -
                     (fVar139 * fVar238 + fVar155 * fVar250);
                fStack_4a0 = (fVar100 * fStack_510 + 0.0) - (fVar139 * fVar243 + fVar155 * fVar252);
                fStack_49c = (fVar100 * fStack_50c + 0.0) - fVar245;
                fVar139 = (float)local_4a8._4_4_ * (float)local_4a8._4_4_;
                fStack_490 = fStack_4a0 * fStack_4a0;
                fStack_48c = fStack_49c * fStack_49c;
                local_498._0_4_ =
                     fVar139 + (float)local_4a8._0_4_ * (float)local_4a8._0_4_ + fStack_490;
                local_498._4_4_ = fVar139 + fVar139 + fStack_48c;
                fStack_490 = fVar139 + fStack_490 + fStack_490;
                fStack_48c = fVar139 + fStack_48c + fStack_48c;
                fVar139 = (float)local_488._0_4_;
                if ((float)local_488._0_4_ <= fVar229) {
                  fVar139 = fVar229;
                }
                fVar236 = fVar169 * fVar169 + fVar168 * fVar168 + fVar196 * fVar196;
                auVar70 = ZEXT416((uint)fVar236);
                auVar205 = rsqrtss(ZEXT416((uint)fVar236),auVar70);
                fVar229 = auVar205._0_4_;
                fVar237 = fVar229 * 1.5 - fVar229 * fVar229 * fVar236 * 0.5 * fVar229;
                fVar260 = fVar168 * fVar237;
                fVar262 = fVar169 * fVar237;
                fVar264 = fVar196 * fVar237;
                fVar266 = fVar197 * fVar237;
                fVar250 = fVar196 * fVar170 + fVar169 * fVar228 + fVar168 * fVar210;
                auVar70 = rcpss(auVar70,auVar70);
                fVar230 = (2.0 - fVar236 * auVar70._0_4_) * auVar70._0_4_;
                fVar229 = (float)local_4a8._4_4_ * fVar262;
                fVar238 = fStack_4a0 * fVar264;
                fVar243 = fStack_49c * fVar266;
                fVar244 = fVar229 + (float)local_4a8._0_4_ * fVar260 + fVar238;
                fVar249 = fVar229 + fVar229 + fVar243;
                fVar238 = fVar229 + fVar238 + fVar238;
                fVar243 = fVar229 + fVar243 + fVar243;
                fVar252 = (SQRT((float)local_498._0_4_) + 1.0) *
                          ((float)local_488._0_4_ / SQRT(fVar236)) +
                          SQRT((float)local_498._0_4_) * (float)local_488._0_4_ + fVar139;
                fVar229 = fStack_50c * fVar266;
                fVar266 = fVar266 * -fVar197;
                fVar237 = fVar264 * -fVar196 + fVar262 * -fVar169 + fVar260 * -fVar168 +
                          fVar230 * (fVar236 * fVar170 - fVar250 * fVar196) * fVar237 * fStack_4a0 +
                          fVar230 * (fVar236 * fVar228 - fVar250 * fVar169) * fVar237 *
                          (float)local_4a8._4_4_ +
                          fVar230 * (fVar236 * fVar210 - fVar250 * fVar168) * fVar237 *
                          (float)local_4a8._0_4_;
                fVar170 = fStack_510 * fVar264 +
                          (float)local_518._4_4_ * fVar262 + (float)local_518._0_4_ * fVar260;
                fVar230 = (float)local_498._0_4_ - fVar244 * fVar244;
                auVar268._0_8_ = CONCAT44((float)local_498._4_4_ - fVar249 * fVar249,fVar230);
                auVar268._8_4_ = fStack_490 - fVar238 * fVar238;
                auVar268._12_4_ = fStack_48c - fVar243 * fVar243;
                fStack_520 = -fVar196 * fStack_4a0;
                fStack_524 = -fVar197 * fStack_49c;
                local_608 = CONCAT44(fVar266,fVar237);
                local_528 = (fStack_520 +
                            -fVar169 * (float)local_4a8._4_4_ + -fVar168 * (float)local_4a8._0_4_) -
                            fVar244 * fVar237;
                fStack_51c = fStack_524;
                fVar228 = fStack_50c * fStack_49c;
                fVar210 = (fStack_510 * fStack_4a0 +
                          (float)local_518._4_4_ * (float)local_4a8._4_4_ +
                          (float)local_518._0_4_ * (float)local_4a8._0_4_) - fVar244 * fVar170;
                auVar124._8_4_ = auVar268._8_4_;
                auVar124._0_8_ = auVar268._0_8_;
                auVar124._12_4_ = auVar268._12_4_;
                auVar70 = rsqrtss(auVar124,auVar268);
                fVar236 = auVar70._0_4_;
                auVar162._0_4_ = fVar236 * 1.5 - fVar236 * fVar236 * fVar230 * 0.5 * fVar236;
                auVar162._4_12_ = auVar70._4_12_;
                if (fVar230 < 0.0) {
                  _local_4e8 = auVar162;
                  local_4d8 = fVar210;
                  fStack_4d4 = fVar228;
                  fStack_4d0 = fStack_510 * fStack_4a0;
                  fStack_4cc = fVar228;
                  local_4c8 = fVar170;
                  fStack_4c4 = fVar229;
                  fStack_4c0 = fStack_510 * fVar264;
                  fStack_4bc = fVar229;
                  local_4b8 = fVar168;
                  fStack_4b4 = fVar169;
                  fStack_4b0 = fVar196;
                  fStack_4ac = fVar197;
                  fVar230 = sqrtf(fVar230);
                  uVar45 = extraout_RAX;
                  auVar162 = _local_4e8;
                  fVar170 = local_4c8;
                  fVar229 = fStack_4c4;
                  fVar210 = local_4d8;
                  fVar228 = fStack_4d4;
                  fVar168 = local_4b8;
                  fVar169 = fStack_4b4;
                  fVar196 = fStack_4b0;
                  fVar197 = fStack_4ac;
                }
                else {
                  fVar230 = SQRT(fVar230);
                }
                fVar230 = fVar230 - fVar245;
                fVar236 = local_528 * auVar162._0_4_ - fVar197;
                fVar210 = fVar210 * auVar162._0_4_;
                auVar163._0_4_ = fVar237 * fVar210 - fVar170 * fVar236;
                auVar176._8_4_ = -fStack_524;
                auVar176._0_8_ = CONCAT44(fStack_524,fVar236) ^ 0x8000000000000000;
                auVar176._12_4_ = fVar228;
                auVar175._8_8_ = auVar176._8_8_;
                auVar175._0_8_ = CONCAT44(fVar210,fVar236) ^ 0x80000000;
                auVar163._4_4_ = auVar163._0_4_;
                auVar163._8_4_ = auVar163._0_4_;
                auVar163._12_4_ = auVar163._0_4_;
                auVar70 = divps(auVar175,auVar163);
                auVar192._8_4_ = fVar266;
                auVar192._0_8_ = local_608;
                auVar192._12_4_ = -fVar229;
                auVar191._8_8_ = auVar192._8_8_;
                auVar191._0_8_ = CONCAT44(fVar170,fVar237) ^ 0x8000000000000000;
                auVar205 = divps(auVar191,auVar163);
                fVar100 = fVar100 - (fVar230 * auVar205._0_4_ + fVar244 * auVar70._0_4_);
                fVar155 = fVar155 - (fVar230 * auVar205._4_4_ + fVar244 * auVar70._4_4_);
                if ((ABS(fVar244) < fVar252) &&
                   (ABS(fVar230) < local_4f8 * 1.9073486e-06 + fVar139 + fVar252)) {
                  fVar100 = (float)local_3d8._0_4_ + fVar100;
                  if (((fVar61 <= fVar100) &&
                      ((fVar139 = *(float *)(ray + k * 4 + 0x80), fVar100 <= fVar139 &&
                       (0.0 <= fVar155)))) && (fVar155 <= 1.0)) {
                    auVar70 = rsqrtss(_local_498,_local_498);
                    fVar170 = auVar70._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar55].ptr;
                    uVar45 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar228 = fVar170 * 1.5 + fVar170 * fVar170 * local_498._0_4_ * -0.5 * fVar170
                      ;
                      fVar229 = (float)local_4a8._0_4_ * fVar228;
                      fVar236 = (float)local_4a8._4_4_ * fVar228;
                      fVar228 = fStack_4a0 * fVar228;
                      fVar170 = fVar197 * fVar229 + fVar168;
                      fVar210 = fVar197 * fVar236 + fVar169;
                      fVar197 = fVar197 * fVar228 + fVar196;
                      fVar230 = fVar236 * fVar168 - fVar169 * fVar229;
                      fVar236 = fVar228 * fVar169 - fVar196 * fVar236;
                      fVar169 = fVar229 * fVar196 - fVar168 * fVar228;
                      fVar168 = fVar210 * fVar236 - fVar169 * fVar170;
                      fVar169 = fVar197 * fVar169 - fVar230 * fVar210;
                      fVar196 = fVar170 * fVar230 - fVar236 * fVar197;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar100;
                        *(float *)(ray + k * 4 + 0xc0) = fVar169;
                        *(float *)(ray + k * 4 + 0xd0) = fVar196;
                        *(float *)(ray + k * 4 + 0xe0) = fVar168;
                        *(float *)(ray + k * 4 + 0xf0) = fVar155;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(float *)(ray + k * 4 + 0x110) = local_578;
                        *(uint *)(ray + k * 4 + 0x120) = uVar55;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar56 = context->user->instPrimID[0];
                        uVar45 = (ulong)uVar56;
                        *(uint *)(ray + k * 4 + 0x140) = uVar56;
                      }
                      else {
                        local_368._4_4_ = fVar169;
                        local_368._0_4_ = fVar169;
                        fStack_360 = fVar169;
                        fStack_35c = fVar169;
                        local_358 = fVar196;
                        fStack_354 = fVar196;
                        fStack_350 = fVar196;
                        fStack_34c = fVar196;
                        local_348 = fVar168;
                        fStack_344 = fVar168;
                        fStack_340 = fVar168;
                        fStack_33c = fVar168;
                        local_338 = fVar155;
                        fStack_334 = fVar155;
                        fStack_330 = fVar155;
                        fStack_32c = fVar155;
                        local_328 = 0;
                        uStack_320 = 0;
                        local_318 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_310 = CONCAT44(uStack_39c,uStack_3a0);
                        local_308 = CONCAT44(uStack_394,local_398);
                        uStack_300 = CONCAT44(uStack_38c,uStack_390);
                        local_2f8 = context->user->instID[0];
                        uStack_2f4 = local_2f8;
                        uStack_2f0 = local_2f8;
                        uStack_2ec = local_2f8;
                        local_2e8 = context->user->instPrimID[0];
                        uStack_2e4 = local_2e8;
                        uStack_2e0 = local_2e8;
                        uStack_2dc = local_2e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar100;
                        local_5b8 = *local_478;
                        _local_5a8 = (int *)local_5b8;
                        uStack_5a0 = pGVar7->userPtr;
                        local_598 = context->user;
                        local_590 = ray;
                        local_588 = (RTCHitN *)local_368;
                        local_580 = 4;
                        p_Var47 = pGVar7->intersectionFilterN;
                        if (p_Var47 != (RTCFilterFunctionN)0x0) {
                          p_Var47 = (RTCFilterFunctionN)
                                    (*p_Var47)((RTCFilterFunctionNArguments *)local_5a8);
                        }
                        auVar125._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                        auVar125._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                        auVar125._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                        auVar125._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                        uVar56 = movmskps((int)p_Var47,auVar125);
                        pRVar46 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                        if ((uVar56 ^ 0xf) == 0) {
                          auVar125 = auVar125 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var47 = context->args->filter;
                          if ((p_Var47 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            p_Var47 = (RTCFilterFunctionN)
                                      (*p_Var47)((RTCFilterFunctionNArguments *)local_5a8);
                          }
                          auVar91._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                          auVar91._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                          auVar91._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                          auVar91._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                          auVar125 = auVar91 ^ _DAT_01f7ae20;
                          uVar56 = movmskps((int)p_Var47,auVar91);
                          pRVar46 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                          if ((uVar56 ^ 0xf) != 0) {
                            uVar56 = *(uint *)(local_588 + 4);
                            uVar57 = *(uint *)(local_588 + 8);
                            uVar58 = *(uint *)(local_588 + 0xc);
                            *(uint *)(local_590 + 0xc0) =
                                 ~auVar91._0_4_ & *(uint *)local_588 |
                                 *(uint *)(local_590 + 0xc0) & auVar91._0_4_;
                            *(uint *)(local_590 + 0xc4) =
                                 ~auVar91._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xc4) & auVar91._4_4_;
                            *(uint *)(local_590 + 200) =
                                 ~auVar91._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 200) & auVar91._8_4_;
                            *(uint *)(local_590 + 0xcc) =
                                 ~auVar91._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xcc) & auVar91._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x14);
                            uVar57 = *(uint *)(local_588 + 0x18);
                            uVar58 = *(uint *)(local_588 + 0x1c);
                            *(uint *)(local_590 + 0xd0) =
                                 ~auVar91._0_4_ & *(uint *)(local_588 + 0x10) |
                                 *(uint *)(local_590 + 0xd0) & auVar91._0_4_;
                            *(uint *)(local_590 + 0xd4) =
                                 ~auVar91._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xd4) & auVar91._4_4_;
                            *(uint *)(local_590 + 0xd8) =
                                 ~auVar91._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0xd8) & auVar91._8_4_;
                            *(uint *)(local_590 + 0xdc) =
                                 ~auVar91._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xdc) & auVar91._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x24);
                            uVar57 = *(uint *)(local_588 + 0x28);
                            uVar58 = *(uint *)(local_588 + 0x2c);
                            *(uint *)(local_590 + 0xe0) =
                                 ~auVar91._0_4_ & *(uint *)(local_588 + 0x20) |
                                 *(uint *)(local_590 + 0xe0) & auVar91._0_4_;
                            *(uint *)(local_590 + 0xe4) =
                                 ~auVar91._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xe4) & auVar91._4_4_;
                            *(uint *)(local_590 + 0xe8) =
                                 ~auVar91._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0xe8) & auVar91._8_4_;
                            *(uint *)(local_590 + 0xec) =
                                 ~auVar91._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xec) & auVar91._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x34);
                            uVar57 = *(uint *)(local_588 + 0x38);
                            uVar58 = *(uint *)(local_588 + 0x3c);
                            *(uint *)(local_590 + 0xf0) =
                                 ~auVar91._0_4_ & *(uint *)(local_588 + 0x30) |
                                 *(uint *)(local_590 + 0xf0) & auVar91._0_4_;
                            *(uint *)(local_590 + 0xf4) =
                                 ~auVar91._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xf4) & auVar91._4_4_;
                            *(uint *)(local_590 + 0xf8) =
                                 ~auVar91._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0xf8) & auVar91._8_4_;
                            *(uint *)(local_590 + 0xfc) =
                                 ~auVar91._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xfc) & auVar91._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x44);
                            uVar57 = *(uint *)(local_588 + 0x48);
                            uVar58 = *(uint *)(local_588 + 0x4c);
                            *(uint *)(local_590 + 0x100) =
                                 ~auVar91._0_4_ & *(uint *)(local_588 + 0x40) |
                                 *(uint *)(local_590 + 0x100) & auVar91._0_4_;
                            *(uint *)(local_590 + 0x104) =
                                 ~auVar91._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0x104) & auVar91._4_4_;
                            *(uint *)(local_590 + 0x108) =
                                 ~auVar91._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0x108) & auVar91._8_4_;
                            *(uint *)(local_590 + 0x10c) =
                                 ~auVar91._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0x10c) & auVar91._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x54);
                            uVar57 = *(uint *)(local_588 + 0x58);
                            uVar58 = *(uint *)(local_588 + 0x5c);
                            *(uint *)(local_590 + 0x110) =
                                 *(uint *)(local_590 + 0x110) & auVar91._0_4_ |
                                 ~auVar91._0_4_ & *(uint *)(local_588 + 0x50);
                            *(uint *)(local_590 + 0x114) =
                                 *(uint *)(local_590 + 0x114) & auVar91._4_4_ |
                                 ~auVar91._4_4_ & uVar56;
                            *(uint *)(local_590 + 0x118) =
                                 *(uint *)(local_590 + 0x118) & auVar91._8_4_ |
                                 ~auVar91._8_4_ & uVar57;
                            *(uint *)(local_590 + 0x11c) =
                                 *(uint *)(local_590 + 0x11c) & auVar91._12_4_ |
                                 ~auVar91._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_588 + 100);
                            uVar57 = *(uint *)(local_588 + 0x68);
                            uVar58 = *(uint *)(local_588 + 0x6c);
                            *(uint *)(local_590 + 0x120) =
                                 *(uint *)(local_590 + 0x120) & auVar91._0_4_ |
                                 ~auVar91._0_4_ & *(uint *)(local_588 + 0x60);
                            *(uint *)(local_590 + 0x124) =
                                 *(uint *)(local_590 + 0x124) & auVar91._4_4_ |
                                 ~auVar91._4_4_ & uVar56;
                            *(uint *)(local_590 + 0x128) =
                                 *(uint *)(local_590 + 0x128) & auVar91._8_4_ |
                                 ~auVar91._8_4_ & uVar57;
                            *(uint *)(local_590 + 300) =
                                 *(uint *)(local_590 + 300) & auVar91._12_4_ |
                                 ~auVar91._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_588 + 0x74);
                            uVar57 = *(uint *)(local_588 + 0x78);
                            uVar58 = *(uint *)(local_588 + 0x7c);
                            *(uint *)(local_590 + 0x130) =
                                 ~auVar91._0_4_ & *(uint *)(local_588 + 0x70) |
                                 *(uint *)(local_590 + 0x130) & auVar91._0_4_;
                            *(uint *)(local_590 + 0x134) =
                                 ~auVar91._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0x134) & auVar91._4_4_;
                            *(uint *)(local_590 + 0x138) =
                                 ~auVar91._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0x138) & auVar91._8_4_;
                            *(uint *)(local_590 + 0x13c) =
                                 ~auVar91._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0x13c) & auVar91._12_4_;
                            *(undefined1 (*) [16])(local_590 + 0x140) =
                                 ~auVar91 & *(undefined1 (*) [16])(local_588 + 0x80) |
                                 *(undefined1 (*) [16])(local_590 + 0x140) & auVar91;
                            pRVar46 = local_590;
                          }
                        }
                        auVar126._0_4_ = auVar125._0_4_ << 0x1f;
                        auVar126._4_4_ = auVar125._4_4_ << 0x1f;
                        auVar126._8_4_ = auVar125._8_4_ << 0x1f;
                        auVar126._12_4_ = auVar125._12_4_ << 0x1f;
                        iVar42 = movmskps((int)pRVar46,auVar126);
                        uVar45 = CONCAT44((int)((ulong)pRVar46 >> 0x20),iVar42);
                        if (iVar42 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar139;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar44 = lVar44 + -1;
              } while (lVar44 != 0);
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              local_3b8._0_4_ = -(uint)(local_538 <= fVar170) & local_3b8._0_4_;
              local_3b8._4_4_ = -(uint)(fStack_534 <= fVar170) & local_3b8._4_4_;
              local_3b8._8_4_ = -(uint)(fStack_530 <= fVar170) & local_3b8._8_4_;
              local_3b8._12_4_ = -(uint)(fStack_52c <= fVar170) & local_3b8._12_4_;
              uVar49 = (undefined4)(uVar45 >> 0x20);
              iVar42 = movmskps((int)uVar45,local_3b8);
            } while (iVar42 != 0);
          }
          auVar127._0_4_ = -(uint)(auVar186._0_4_ + local_558 <= fVar170) & local_3f8._0_4_;
          auVar127._4_4_ = -(uint)(auVar186._4_4_ + fStack_554 <= fVar170) & local_3f8._4_4_;
          auVar127._8_4_ = -(uint)(auVar186._8_4_ + fStack_550 <= fVar170) & (uint)fStack_3f0;
          auVar127._12_4_ = -(uint)(auVar186._12_4_ + fStack_54c <= fVar170) & (uint)fStack_3ec;
          auVar147._0_4_ =
               -(uint)((int)local_408 <
                      ((int)((-(uint)(0.3 <= ABS(fVar137 + fVar180 * (float)local_618._4_4_ +
                                                           fVar138)) & local_508._0_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar147._4_4_ =
               -(uint)((int)fStack_404 <
                      ((int)((-(uint)(0.3 <= ABS(fVar154 + fVar181 * (float)local_618._4_4_ +
                                                           fVar156)) & local_508._4_4_) << 0x1f) >>
                      0x1f) + 4);
          auVar147._8_4_ =
               -(uint)((int)fStack_400 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_620 +
                                                 fVar208 * (float)local_618._4_4_ + fVar182)) &
                             (uint)fStack_500) << 0x1f) >> 0x1f) + 4);
          auVar147._12_4_ =
               -(uint)((int)fStack_3fc <
                      ((int)((-(uint)(0.3 <= ABS(fStack_61c +
                                                 fVar209 * (float)local_618._4_4_ + fVar198)) &
                             (uint)fStack_4fc) << 0x1f) >> 0x1f) + 4);
          local_3c8 = ~auVar147 & auVar127;
          iVar42 = movmskps(0,local_3c8);
          if (iVar42 != 0) {
            fVar155 = local_2d8._0_4_;
            fVar100 = local_2d8._4_4_;
            fVar137 = local_2d8._8_4_;
            fVar138 = local_2d8._12_4_;
            local_538 = local_558 + fVar155;
            fStack_534 = fStack_554 + fVar100;
            fStack_530 = fStack_550 + fVar137;
            fStack_52c = fStack_54c + fVar138;
            do {
              uVar56 = local_3c8._0_4_;
              uVar57 = local_3c8._4_4_;
              uVar58 = local_3c8._8_4_;
              uVar59 = local_3c8._12_4_;
              auVar128._0_4_ = uVar56 & (uint)fVar155;
              auVar128._4_4_ = uVar57 & (uint)fVar100;
              auVar128._8_4_ = uVar58 & (uint)fVar137;
              auVar128._12_4_ = uVar59 & (uint)fVar138;
              auVar148._0_8_ = CONCAT44(~uVar57,~uVar56) & 0x7f8000007f800000;
              auVar148._8_4_ = ~uVar58 & 0x7f800000;
              auVar148._12_4_ = ~uVar59 & 0x7f800000;
              auVar148 = auVar148 | auVar128;
              auVar164._4_4_ = auVar148._0_4_;
              auVar164._0_4_ = auVar148._4_4_;
              auVar164._8_4_ = auVar148._12_4_;
              auVar164._12_4_ = auVar148._8_4_;
              auVar70 = minps(auVar164,auVar148);
              auVar129._0_8_ = auVar70._8_8_;
              auVar129._8_4_ = auVar70._0_4_;
              auVar129._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar129,auVar70);
              auVar130._0_8_ =
                   CONCAT44(-(uint)(auVar70._4_4_ == auVar148._4_4_) & uVar57,
                            -(uint)(auVar70._0_4_ == auVar148._0_4_) & uVar56);
              auVar130._8_4_ = -(uint)(auVar70._8_4_ == auVar148._8_4_) & uVar58;
              auVar130._12_4_ = -(uint)(auVar70._12_4_ == auVar148._12_4_) & uVar59;
              iVar42 = movmskps(iVar42,auVar130);
              auVar92 = local_3c8;
              if (iVar42 != 0) {
                auVar92._8_4_ = auVar130._8_4_;
                auVar92._0_8_ = auVar130._0_8_;
                auVar92._12_4_ = auVar130._12_4_;
              }
              uVar43 = movmskps(iVar42,auVar92);
              uVar45 = 0;
              if (CONCAT44(uVar49,uVar43) != 0) {
                for (; (CONCAT44(uVar49,uVar43) >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              *(undefined4 *)(local_3c8 + uVar45 * 4) = 0;
              auVar20._4_4_ = fStack_414;
              auVar20._0_4_ = local_418;
              auVar20._8_4_ = fStack_410;
              auVar20._12_4_ = fStack_40c;
              auVar185 = minps(auVar248,auVar20);
              auVar186 = maxps(auVar248,auVar20);
              auVar18._4_4_ = fStack_424;
              auVar18._0_4_ = local_428;
              auVar18._8_4_ = fStack_420;
              auVar18._12_4_ = fStack_41c;
              auVar16._4_4_ = fStack_434;
              auVar16._0_4_ = local_438;
              auVar16._8_4_ = fStack_430;
              auVar16._12_4_ = fStack_42c;
              auVar70 = minps(auVar18,auVar16);
              auVar185 = minps(auVar185,auVar70);
              auVar70 = maxps(auVar18,auVar16);
              auVar70 = maxps(auVar186,auVar70);
              auVar149._0_8_ = auVar185._0_8_ & 0x7fffffff7fffffff;
              auVar149._8_4_ = auVar185._8_4_ & 0x7fffffff;
              auVar149._12_4_ = auVar185._12_4_ & 0x7fffffff;
              local_4f8 = auVar70._12_4_;
              auVar93._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
              auVar93._8_4_ = auVar70._8_4_ & 0x7fffffff;
              auVar93._12_4_ = ABS(local_4f8);
              auVar70 = maxps(auVar149,auVar93);
              fVar139 = auVar70._4_4_;
              if (auVar70._4_4_ <= auVar70._0_4_) {
                fVar139 = auVar70._0_4_;
              }
              auVar150._8_8_ = auVar70._8_8_;
              auVar150._0_8_ = auVar70._8_8_;
              if (auVar70._8_4_ <= fVar139) {
                auVar150._0_4_ = fVar139;
              }
              fVar156 = auVar150._0_4_ * 1.9073486e-06;
              fStack_4f4 = local_4f8;
              fStack_4f0 = local_4f8;
              fStack_4ec = local_4f8;
              fVar139 = local_118[uVar45];
              fVar154 = *(float *)(local_2c8 + uVar45 * 4);
              lVar44 = 5;
              do {
                fVar197 = SQRT(fVar62) * 1.9073486e-06 * fVar154;
                fVar168 = 1.0 - fVar139;
                fVar182 = local_418 * fVar168 + local_428 * fVar139;
                fVar196 = fStack_414 * fVar168 + fStack_424 * fVar139;
                fVar198 = fStack_410 * fVar168 + fStack_420 * fVar139;
                fVar180 = fStack_40c * fVar168 + fStack_41c * fVar139;
                fVar170 = (auVar248._0_4_ * fVar168 + local_418 * fVar139) * fVar168 +
                          fVar139 * fVar182;
                fVar181 = (auVar248._4_4_ * fVar168 + fStack_414 * fVar139) * fVar168 +
                          fVar139 * fVar196;
                fVar208 = (auVar248._8_4_ * fVar168 + fStack_410 * fVar139) * fVar168 +
                          fVar139 * fVar198;
                fVar169 = (auVar248._12_4_ * fVar168 + fStack_40c * fVar139) * fVar168 +
                          fVar139 * fVar180;
                fVar228 = fVar182 * fVar168 + (local_428 * fVar168 + local_438 * fVar139) * fVar139;
                fVar230 = fVar196 * fVar168 +
                          (fStack_424 * fVar168 + fStack_434 * fVar139) * fVar139;
                fVar237 = fVar198 * fVar168 +
                          (fStack_420 * fVar168 + fStack_430 * fVar139) * fVar139;
                fVar182 = fVar180 * fVar168 +
                          (fStack_41c * fVar168 + fStack_42c * fVar139) * fVar139;
                fVar210 = fVar168 * fVar169 + fVar139 * fVar182;
                fVar229 = (fVar228 - fVar170) * 3.0;
                fVar236 = (fVar230 - fVar181) * 3.0;
                fVar238 = (fVar237 - fVar208) * 3.0;
                fVar243 = (fVar182 - fVar169) * 3.0;
                fVar169 = fVar168 * 6.0;
                fVar180 = (fVar139 - (fVar168 + fVar168)) * 6.0;
                fVar209 = (fVar168 - (fVar139 + fVar139)) * 6.0;
                fVar198 = fVar139 * 6.0;
                fVar182 = fVar169 * auVar248._0_4_ +
                          fVar180 * local_418 + fVar209 * local_428 + fVar198 * local_438;
                fVar196 = fVar169 * auVar248._4_4_ +
                          fVar180 * fStack_414 + fVar209 * fStack_424 + fVar198 * fStack_434;
                fVar169 = fVar169 * auVar248._8_4_ +
                          fVar180 * fStack_410 + fVar209 * fStack_420 + fVar198 * fStack_430;
                fVar198 = (fVar154 * (float)local_518._0_4_ + 0.0) -
                          (fVar168 * fVar170 + fVar139 * fVar228);
                fVar170 = (fVar154 * (float)local_518._4_4_ + 0.0) -
                          (fVar168 * fVar181 + fVar139 * fVar230);
                fVar180 = (fVar154 * fStack_510 + 0.0) - (fVar168 * fVar208 + fVar139 * fVar237);
                fStack_48c = (fVar154 * fStack_50c + 0.0) - fVar210;
                fVar168 = fVar170 * fVar170;
                fStack_480 = fVar180 * fVar180;
                fStack_47c = fStack_48c * fStack_48c;
                local_488._0_4_ = fVar168 + fVar198 * fVar198 + fStack_480;
                local_488._4_4_ = fVar168 + fVar168 + fStack_47c;
                fStack_480 = fVar168 + fStack_480 + fStack_480;
                fStack_47c = fVar168 + fStack_47c + fStack_47c;
                uStack_5d4 = auVar150._4_4_;
                uStack_5d0 = auVar150._8_4_;
                uStack_5cc = auVar150._12_4_;
                fVar168 = fVar156;
                if (fVar156 <= fVar197) {
                  fVar168 = fVar197;
                }
                fVar208 = fVar236 * fVar236 + fVar229 * fVar229 + fVar238 * fVar238;
                auVar70 = ZEXT416((uint)fVar208);
                auVar185 = rsqrtss(ZEXT416((uint)fVar208),auVar70);
                fVar197 = auVar185._0_4_;
                fVar209 = fVar197 * 1.5 - fVar197 * fVar197 * fVar208 * 0.5 * fVar197;
                fVar244 = fVar229 * fVar209;
                fVar245 = fVar236 * fVar209;
                fVar249 = fVar238 * fVar209;
                fVar250 = fVar243 * fVar209;
                fVar237 = fVar238 * fVar169 + fVar236 * fVar196 + fVar229 * fVar182;
                auVar70 = rcpss(auVar70,auVar70);
                fVar181 = (2.0 - fVar208 * auVar70._0_4_) * auVar70._0_4_;
                fVar197 = fVar170 * fVar245;
                fVar228 = fVar180 * fVar249;
                fVar230 = fStack_48c * fVar250;
                fVar252 = fVar197 + fVar198 * fVar244 + fVar228;
                fVar260 = fVar197 + fVar197 + fVar230;
                fVar228 = fVar197 + fVar228 + fVar228;
                fVar230 = fVar197 + fVar230 + fVar230;
                local_528 = (SQRT((float)local_488._0_4_) + 1.0) * (fVar156 / SQRT(fVar208)) +
                            SQRT((float)local_488._0_4_) * fVar156 + fVar168;
                fVar197 = fStack_50c * fVar250;
                fVar250 = fVar250 * -fVar243;
                fVar237 = fVar249 * -fVar238 + fVar245 * -fVar236 + fVar244 * -fVar229 +
                          fVar181 * (fVar208 * fVar169 - fVar237 * fVar238) * fVar209 * fVar180 +
                          fVar181 * (fVar208 * fVar196 - fVar237 * fVar236) * fVar209 * fVar170 +
                          fVar181 * (fVar208 * fVar182 - fVar237 * fVar229) * fVar209 * fVar198;
                fVar196 = fStack_510 * fVar249 +
                          (float)local_518._4_4_ * fVar245 + (float)local_518._0_4_ * fVar244;
                fVar181 = (float)local_488._0_4_ - fVar252 * fVar252;
                auVar94._0_8_ = CONCAT44((float)local_488._4_4_ - fVar260 * fVar260,fVar181);
                auVar94._8_4_ = fStack_480 - fVar228 * fVar228;
                auVar94._12_4_ = fStack_47c - fVar230 * fVar230;
                fVar209 = -fVar243 * fStack_48c;
                local_5c8 = CONCAT44(fVar250,fVar237);
                local_498._4_4_ = fVar170;
                local_498._0_4_ = fVar198;
                fStack_490 = fVar180;
                fVar182 = fStack_50c * fStack_48c;
                fVar169 = (fStack_510 * fVar180 +
                          (float)local_518._4_4_ * fVar170 + (float)local_518._0_4_ * fVar198) -
                          fVar252 * fVar196;
                auVar131._8_4_ = auVar94._8_4_;
                auVar131._0_8_ = auVar94._0_8_;
                auVar131._12_4_ = auVar94._12_4_;
                auVar70 = rsqrtss(auVar131,auVar94);
                fVar208 = auVar70._0_4_;
                auVar165._0_4_ = fVar208 * 1.5 - fVar208 * fVar208 * fVar181 * 0.5 * fVar208;
                auVar165._4_12_ = auVar70._4_12_;
                if (fVar181 < 0.0) {
                  local_4a8._4_4_ = uStack_5d4;
                  local_4a8._0_4_ = fVar168;
                  fStack_4a0 = (float)uStack_5d0;
                  fStack_49c = (float)uStack_5cc;
                  _local_4e8 = auVar165;
                  local_4d8 = fVar169;
                  fStack_4d4 = fVar182;
                  fStack_4d0 = fStack_510 * fVar180;
                  fStack_4cc = fVar182;
                  local_4c8 = fVar196;
                  fStack_4c4 = fVar197;
                  fStack_4c0 = fStack_510 * fVar249;
                  fStack_4bc = fVar197;
                  local_4b8 = fVar252;
                  fStack_4b4 = fVar260;
                  fStack_4b0 = fVar228;
                  fStack_4ac = fVar230;
                  fVar181 = sqrtf(fVar181);
                  uVar45 = extraout_RAX_00;
                  auVar165 = _local_4e8;
                  fVar168 = (float)local_4a8._0_4_;
                  fVar169 = local_4d8;
                  fVar182 = fStack_4d4;
                  fVar208 = local_4b8;
                  fVar196 = local_4c8;
                  fVar197 = fStack_4c4;
                }
                else {
                  fVar181 = SQRT(fVar181);
                  fVar208 = fVar252;
                }
                fVar181 = fVar181 - fVar210;
                fVar198 = ((-fVar238 * fVar180 + -fVar236 * fVar170 + -fVar229 * fVar198) -
                          fVar252 * fVar237) * auVar165._0_4_ - fVar243;
                fVar169 = fVar169 * auVar165._0_4_;
                auVar178._0_8_ = CONCAT44(fVar209,fVar198) ^ 0x8000000080000000;
                auVar166._0_4_ = fVar237 * fVar169 - fVar196 * fVar198;
                auVar178._8_4_ = -fVar209;
                auVar178._12_4_ = fVar182;
                auVar177._8_8_ = auVar178._8_8_;
                auVar177._0_8_ = CONCAT44(fVar169,fVar198) ^ 0x80000000;
                auVar166._4_4_ = auVar166._0_4_;
                auVar166._8_4_ = auVar166._0_4_;
                auVar166._12_4_ = auVar166._0_4_;
                auVar70 = divps(auVar177,auVar166);
                auVar194._8_4_ = fVar250;
                auVar194._0_8_ = local_5c8;
                auVar194._12_4_ = -fVar197;
                auVar193._8_8_ = auVar194._8_8_;
                auVar193._0_8_ = CONCAT44(fVar196,fVar237) ^ 0x8000000000000000;
                auVar185 = divps(auVar193,auVar166);
                fVar154 = fVar154 - (fVar181 * auVar185._0_4_ + fVar208 * auVar70._0_4_);
                fVar139 = fVar139 - (fVar181 * auVar185._4_4_ + fVar208 * auVar70._4_4_);
                if ((ABS(fVar208) < local_528) &&
                   (ABS(fVar181) < local_4f8 * 1.9073486e-06 + fVar168 + local_528)) {
                  fVar154 = (float)local_3d8._0_4_ + fVar154;
                  if ((fVar61 <= fVar154) &&
                     (((fVar156 = *(float *)(ray + k * 4 + 0x80), fVar154 <= fVar156 &&
                       (0.0 <= fVar139)) && (fVar139 <= 1.0)))) {
                    auVar70 = rsqrtss(_local_488,_local_488);
                    fVar168 = auVar70._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar55].ptr;
                    uVar45 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar196 = fVar168 * 1.5 + fVar168 * fVar168 * local_488._0_4_ * -0.5 * fVar168
                      ;
                      fVar197 = (float)local_498._0_4_ * fVar196;
                      fVar170 = (float)local_498._4_4_ * fVar196;
                      fVar196 = fStack_490 * fVar196;
                      fVar168 = fVar243 * fVar197 + fVar229;
                      fVar169 = fVar243 * fVar170 + fVar236;
                      fVar182 = fVar243 * fVar196 + fVar238;
                      fVar198 = fVar170 * fVar229 - fVar236 * fVar197;
                      fVar170 = fVar196 * fVar236 - fVar238 * fVar170;
                      fVar197 = fVar197 * fVar238 - fVar229 * fVar196;
                      fVar196 = fVar169 * fVar170 - fVar197 * fVar168;
                      fVar169 = fVar182 * fVar197 - fVar198 * fVar169;
                      fVar168 = fVar168 * fVar198 - fVar170 * fVar182;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar154;
                        *(float *)(ray + k * 4 + 0xc0) = fVar169;
                        *(float *)(ray + k * 4 + 0xd0) = fVar168;
                        *(float *)(ray + k * 4 + 0xe0) = fVar196;
                        *(float *)(ray + k * 4 + 0xf0) = fVar139;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(float *)(ray + k * 4 + 0x110) = local_578;
                        *(uint *)(ray + k * 4 + 0x120) = uVar55;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar56 = context->user->instPrimID[0];
                        uVar45 = (ulong)uVar56;
                        *(uint *)(ray + k * 4 + 0x140) = uVar56;
                      }
                      else {
                        local_368._4_4_ = fVar169;
                        local_368._0_4_ = fVar169;
                        fStack_360 = fVar169;
                        fStack_35c = fVar169;
                        local_358 = fVar168;
                        fStack_354 = fVar168;
                        fStack_350 = fVar168;
                        fStack_34c = fVar168;
                        local_348 = fVar196;
                        fStack_344 = fVar196;
                        fStack_340 = fVar196;
                        fStack_33c = fVar196;
                        local_338 = fVar139;
                        fStack_334 = fVar139;
                        fStack_330 = fVar139;
                        fStack_32c = fVar139;
                        local_328 = 0;
                        uStack_320 = 0;
                        local_318 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_310 = CONCAT44(uStack_39c,uStack_3a0);
                        local_308 = CONCAT44(uStack_394,local_398);
                        uStack_300 = CONCAT44(uStack_38c,uStack_390);
                        local_2f8 = context->user->instID[0];
                        uStack_2f4 = local_2f8;
                        uStack_2f0 = local_2f8;
                        uStack_2ec = local_2f8;
                        local_2e8 = context->user->instPrimID[0];
                        uStack_2e4 = local_2e8;
                        uStack_2e0 = local_2e8;
                        uStack_2dc = local_2e8;
                        *(float *)(ray + k * 4 + 0x80) = fVar154;
                        local_5b8 = *local_478;
                        _local_5a8 = (int *)local_5b8;
                        uStack_5a0 = pGVar7->userPtr;
                        local_598 = context->user;
                        local_590 = ray;
                        local_588 = (RTCHitN *)local_368;
                        local_580 = 4;
                        p_Var47 = pGVar7->intersectionFilterN;
                        if (p_Var47 != (RTCFilterFunctionN)0x0) {
                          p_Var47 = (RTCFilterFunctionN)
                                    (*p_Var47)((RTCFilterFunctionNArguments *)local_5a8);
                        }
                        auVar132._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                        auVar132._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                        auVar132._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                        auVar132._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                        uVar56 = movmskps((int)p_Var47,auVar132);
                        pRVar46 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                        if ((uVar56 ^ 0xf) == 0) {
                          auVar132 = auVar132 ^ _DAT_01f7ae20;
                        }
                        else {
                          p_Var47 = context->args->filter;
                          if ((p_Var47 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            p_Var47 = (RTCFilterFunctionN)
                                      (*p_Var47)((RTCFilterFunctionNArguments *)local_5a8);
                          }
                          auVar95._0_4_ = -(uint)(local_5b8._0_4_ == 0);
                          auVar95._4_4_ = -(uint)(local_5b8._4_4_ == 0);
                          auVar95._8_4_ = -(uint)(local_5b8._8_4_ == 0);
                          auVar95._12_4_ = -(uint)(local_5b8._12_4_ == 0);
                          auVar132 = auVar95 ^ _DAT_01f7ae20;
                          uVar56 = movmskps((int)p_Var47,auVar95);
                          pRVar46 = (RayHitK<4> *)(ulong)(uVar56 ^ 0xf);
                          if ((uVar56 ^ 0xf) != 0) {
                            uVar56 = *(uint *)(local_588 + 4);
                            uVar57 = *(uint *)(local_588 + 8);
                            uVar58 = *(uint *)(local_588 + 0xc);
                            *(uint *)(local_590 + 0xc0) =
                                 ~auVar95._0_4_ & *(uint *)local_588 |
                                 *(uint *)(local_590 + 0xc0) & auVar95._0_4_;
                            *(uint *)(local_590 + 0xc4) =
                                 ~auVar95._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xc4) & auVar95._4_4_;
                            *(uint *)(local_590 + 200) =
                                 ~auVar95._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 200) & auVar95._8_4_;
                            *(uint *)(local_590 + 0xcc) =
                                 ~auVar95._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xcc) & auVar95._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x14);
                            uVar57 = *(uint *)(local_588 + 0x18);
                            uVar58 = *(uint *)(local_588 + 0x1c);
                            *(uint *)(local_590 + 0xd0) =
                                 ~auVar95._0_4_ & *(uint *)(local_588 + 0x10) |
                                 *(uint *)(local_590 + 0xd0) & auVar95._0_4_;
                            *(uint *)(local_590 + 0xd4) =
                                 ~auVar95._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xd4) & auVar95._4_4_;
                            *(uint *)(local_590 + 0xd8) =
                                 ~auVar95._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0xd8) & auVar95._8_4_;
                            *(uint *)(local_590 + 0xdc) =
                                 ~auVar95._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xdc) & auVar95._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x24);
                            uVar57 = *(uint *)(local_588 + 0x28);
                            uVar58 = *(uint *)(local_588 + 0x2c);
                            *(uint *)(local_590 + 0xe0) =
                                 ~auVar95._0_4_ & *(uint *)(local_588 + 0x20) |
                                 *(uint *)(local_590 + 0xe0) & auVar95._0_4_;
                            *(uint *)(local_590 + 0xe4) =
                                 ~auVar95._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xe4) & auVar95._4_4_;
                            *(uint *)(local_590 + 0xe8) =
                                 ~auVar95._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0xe8) & auVar95._8_4_;
                            *(uint *)(local_590 + 0xec) =
                                 ~auVar95._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xec) & auVar95._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x34);
                            uVar57 = *(uint *)(local_588 + 0x38);
                            uVar58 = *(uint *)(local_588 + 0x3c);
                            *(uint *)(local_590 + 0xf0) =
                                 ~auVar95._0_4_ & *(uint *)(local_588 + 0x30) |
                                 *(uint *)(local_590 + 0xf0) & auVar95._0_4_;
                            *(uint *)(local_590 + 0xf4) =
                                 ~auVar95._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0xf4) & auVar95._4_4_;
                            *(uint *)(local_590 + 0xf8) =
                                 ~auVar95._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0xf8) & auVar95._8_4_;
                            *(uint *)(local_590 + 0xfc) =
                                 ~auVar95._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0xfc) & auVar95._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x44);
                            uVar57 = *(uint *)(local_588 + 0x48);
                            uVar58 = *(uint *)(local_588 + 0x4c);
                            *(uint *)(local_590 + 0x100) =
                                 ~auVar95._0_4_ & *(uint *)(local_588 + 0x40) |
                                 *(uint *)(local_590 + 0x100) & auVar95._0_4_;
                            *(uint *)(local_590 + 0x104) =
                                 ~auVar95._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0x104) & auVar95._4_4_;
                            *(uint *)(local_590 + 0x108) =
                                 ~auVar95._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0x108) & auVar95._8_4_;
                            *(uint *)(local_590 + 0x10c) =
                                 ~auVar95._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0x10c) & auVar95._12_4_;
                            uVar56 = *(uint *)(local_588 + 0x54);
                            uVar57 = *(uint *)(local_588 + 0x58);
                            uVar58 = *(uint *)(local_588 + 0x5c);
                            *(uint *)(local_590 + 0x110) =
                                 *(uint *)(local_590 + 0x110) & auVar95._0_4_ |
                                 ~auVar95._0_4_ & *(uint *)(local_588 + 0x50);
                            *(uint *)(local_590 + 0x114) =
                                 *(uint *)(local_590 + 0x114) & auVar95._4_4_ |
                                 ~auVar95._4_4_ & uVar56;
                            *(uint *)(local_590 + 0x118) =
                                 *(uint *)(local_590 + 0x118) & auVar95._8_4_ |
                                 ~auVar95._8_4_ & uVar57;
                            *(uint *)(local_590 + 0x11c) =
                                 *(uint *)(local_590 + 0x11c) & auVar95._12_4_ |
                                 ~auVar95._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_588 + 100);
                            uVar57 = *(uint *)(local_588 + 0x68);
                            uVar58 = *(uint *)(local_588 + 0x6c);
                            *(uint *)(local_590 + 0x120) =
                                 *(uint *)(local_590 + 0x120) & auVar95._0_4_ |
                                 ~auVar95._0_4_ & *(uint *)(local_588 + 0x60);
                            *(uint *)(local_590 + 0x124) =
                                 *(uint *)(local_590 + 0x124) & auVar95._4_4_ |
                                 ~auVar95._4_4_ & uVar56;
                            *(uint *)(local_590 + 0x128) =
                                 *(uint *)(local_590 + 0x128) & auVar95._8_4_ |
                                 ~auVar95._8_4_ & uVar57;
                            *(uint *)(local_590 + 300) =
                                 *(uint *)(local_590 + 300) & auVar95._12_4_ |
                                 ~auVar95._12_4_ & uVar58;
                            uVar56 = *(uint *)(local_588 + 0x74);
                            uVar57 = *(uint *)(local_588 + 0x78);
                            uVar58 = *(uint *)(local_588 + 0x7c);
                            *(uint *)(local_590 + 0x130) =
                                 ~auVar95._0_4_ & *(uint *)(local_588 + 0x70) |
                                 *(uint *)(local_590 + 0x130) & auVar95._0_4_;
                            *(uint *)(local_590 + 0x134) =
                                 ~auVar95._4_4_ & uVar56 |
                                 *(uint *)(local_590 + 0x134) & auVar95._4_4_;
                            *(uint *)(local_590 + 0x138) =
                                 ~auVar95._8_4_ & uVar57 |
                                 *(uint *)(local_590 + 0x138) & auVar95._8_4_;
                            *(uint *)(local_590 + 0x13c) =
                                 ~auVar95._12_4_ & uVar58 |
                                 *(uint *)(local_590 + 0x13c) & auVar95._12_4_;
                            *(undefined1 (*) [16])(local_590 + 0x140) =
                                 ~auVar95 & *(undefined1 (*) [16])(local_588 + 0x80) |
                                 *(undefined1 (*) [16])(local_590 + 0x140) & auVar95;
                            pRVar46 = local_590;
                          }
                        }
                        auVar133._0_4_ = auVar132._0_4_ << 0x1f;
                        auVar133._4_4_ = auVar132._4_4_ << 0x1f;
                        auVar133._8_4_ = auVar132._8_4_ << 0x1f;
                        auVar133._12_4_ = auVar132._12_4_ << 0x1f;
                        iVar42 = movmskps((int)pRVar46,auVar133);
                        uVar45 = CONCAT44((int)((ulong)pRVar46 >> 0x20),iVar42);
                        if (iVar42 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar156;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar44 = lVar44 + -1;
              } while (lVar44 != 0);
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              local_3c8._0_4_ = -(uint)(local_538 <= fVar170) & local_3c8._0_4_;
              local_3c8._4_4_ = -(uint)(fStack_534 <= fVar170) & local_3c8._4_4_;
              local_3c8._8_4_ = -(uint)(fStack_530 <= fVar170) & local_3c8._8_4_;
              local_3c8._12_4_ = -(uint)(fStack_52c <= fVar170) & local_3c8._12_4_;
              uVar49 = (undefined4)(uVar45 >> 0x20);
              iVar42 = movmskps((int)uVar45,local_3c8);
            } while (iVar42 != 0);
            iVar42 = 0;
          }
          auVar179._0_4_ =
               local_568._0_4_ & local_3e8._0_4_ &
               -(uint)(local_558 + (float)local_138._0_4_ <= fVar170);
          auVar179._4_4_ =
               local_568._4_4_ & local_3e8._4_4_ &
               -(uint)(fStack_554 + (float)local_138._4_4_ <= fVar170);
          auVar179._8_4_ =
               (uint)fStack_560 & (uint)fStack_3e0 & -(uint)(fStack_550 + fStack_130 <= fVar170);
          auVar179._12_4_ =
               (uint)fStack_55c & (uint)fStack_3dc & -(uint)(fStack_54c + fStack_12c <= fVar170);
          auVar134._4_4_ = -(uint)(fStack_554 + local_2d8._4_4_ <= fVar170);
          auVar134._0_4_ = -(uint)(local_558 + local_2d8._0_4_ <= fVar170);
          auVar134._8_4_ = -(uint)(fStack_550 + local_2d8._8_4_ <= fVar170);
          auVar134._12_4_ = -(uint)(fStack_54c + local_2d8._12_4_ <= fVar170);
          auVar70 = auVar147 & auVar127 & auVar134 | auVar179;
          uVar56 = movmskps(iVar42,auVar70);
          pauVar48 = (undefined1 (*) [16])(ulong)uVar56;
          fVar155 = local_578;
          if (uVar56 != 0) {
            pauVar48 = (undefined1 (*) [16])(uVar51 * 0x30);
            *(undefined1 (*) [16])(auStack_f8 + (long)pauVar48) = auVar70;
            auStack_e8[uVar51 * 0xc] =
                 ~auVar179._0_4_ & (uint)local_2d8._0_4_ | local_138._0_4_ & auVar179._0_4_;
            *(uint *)(&stack0x0000000c + (long)pauVar48[-0xf]) =
                 ~auVar179._4_4_ & (uint)local_2d8._4_4_ | local_138._4_4_ & auVar179._4_4_;
            *(uint *)(&stack0x00000000 + (long)pauVar48[-0xe]) =
                 ~auVar179._8_4_ & (uint)local_2d8._8_4_ | (uint)fStack_130 & auVar179._8_4_;
            *(uint *)(&stack0x00000004 + (long)pauVar48[-0xe]) =
                 ~auVar179._12_4_ & (uint)local_2d8._12_4_ | (uint)fStack_12c & auVar179._12_4_;
            (&uStack_d8)[uVar51 * 6] = CONCAT44(fStack_1d4,local_1d8);
            aiStack_d0[uVar51 * 0xc] = iVar50 + 1;
            iVar53 = iVar53 + 1;
          }
        }
      }
    }
    if (iVar53 == 0) break;
    fVar100 = *(float *)(ray + k * 4 + 0x80);
    uVar57 = -iVar53;
    pauVar48 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar53 - 1) * 0x30);
    uVar56 = uVar57;
    while( true ) {
      auVar135._0_4_ = -(uint)(local_558 + *(float *)pauVar48[1] <= fVar100) & *(uint *)*pauVar48;
      auVar135._4_4_ =
           -(uint)(fStack_554 + *(float *)(pauVar48[1] + 4) <= fVar100) & *(uint *)(*pauVar48 + 4);
      auVar135._8_4_ =
           -(uint)(fStack_550 + *(float *)(pauVar48[1] + 8) <= fVar100) & *(uint *)(*pauVar48 + 8);
      auVar135._12_4_ =
           -(uint)(fStack_54c + *(float *)(pauVar48[1] + 0xc) <= fVar100) &
           *(uint *)(*pauVar48 + 0xc);
      _local_368 = auVar135;
      iVar50 = movmskps(uVar57,auVar135);
      if (iVar50 != 0) break;
      pauVar48 = pauVar48 + -3;
      uVar56 = uVar56 + 1;
      uVar57 = 0;
      if (uVar56 == 0) goto LAB_00a24bf2;
    }
    auVar151._0_4_ = (uint)*(float *)pauVar48[1] & auVar135._0_4_;
    auVar151._4_4_ = (uint)*(float *)(pauVar48[1] + 4) & auVar135._4_4_;
    auVar151._8_4_ = (uint)*(float *)(pauVar48[1] + 8) & auVar135._8_4_;
    auVar151._12_4_ = (uint)*(float *)(pauVar48[1] + 0xc) & auVar135._12_4_;
    auVar167._0_8_ = CONCAT44(~auVar135._4_4_,~auVar135._0_4_) & 0x7f8000007f800000;
    auVar167._8_4_ = ~auVar135._8_4_ & 0x7f800000;
    auVar167._12_4_ = ~auVar135._12_4_ & 0x7f800000;
    auVar167 = auVar167 | auVar151;
    auVar152._4_4_ = auVar167._0_4_;
    auVar152._0_4_ = auVar167._4_4_;
    auVar152._8_4_ = auVar167._12_4_;
    auVar152._12_4_ = auVar167._8_4_;
    auVar70 = minps(auVar152,auVar167);
    auVar96._0_8_ = auVar70._8_8_;
    auVar96._8_4_ = auVar70._0_4_;
    auVar96._12_4_ = auVar70._4_4_;
    auVar70 = minps(auVar96,auVar70);
    auVar97._0_8_ =
         CONCAT44(-(uint)(auVar70._4_4_ == auVar167._4_4_) & auVar135._4_4_,
                  -(uint)(auVar70._0_4_ == auVar167._0_4_) & auVar135._0_4_);
    auVar97._8_4_ = -(uint)(auVar70._8_4_ == auVar167._8_4_) & auVar135._8_4_;
    auVar97._12_4_ = -(uint)(auVar70._12_4_ == auVar167._12_4_) & auVar135._12_4_;
    iVar42 = movmskps(iVar50,auVar97);
    if (iVar42 != 0) {
      auVar135._8_4_ = auVar97._8_4_;
      auVar135._0_8_ = auVar97._0_8_;
      auVar135._12_4_ = auVar97._12_4_;
    }
    uVar5 = *(undefined8 *)pauVar48[2];
    iVar50 = *(int *)(pauVar48[2] + 8);
    uVar57 = movmskps(iVar42,auVar135);
    lVar8 = 0;
    if (uVar57 != 0) {
      for (; (uVar57 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
      }
    }
    *(undefined4 *)(local_368 + lVar8 * 4) = 0;
    *pauVar48 = _local_368;
    iVar42 = movmskps((int)pauVar48,_local_368);
    lVar44 = CONCAT44((int)((ulong)pauVar48 >> 0x20),iVar42);
    uVar57 = ~uVar56;
    if (iVar42 != 0) {
      uVar57 = -uVar56;
    }
    uVar51 = (ulong)uVar57;
    fVar100 = (float)uVar5;
    fVar137 = (float)((ulong)uVar5 >> 0x20) - fVar100;
    _local_5a8 = (int *)CONCAT44(fVar137 * 0.33333334 + fVar100,fVar137 * 0.0 + fVar100);
    uStack_5a0 = (void *)CONCAT44(fVar137 * 1.0 + fVar100,fVar137 * 0.6666667 + fVar100);
    local_1d8 = *(float *)(local_5a8 + lVar8 * 4);
    fStack_1d4 = *(float *)(local_5a8 + lVar8 * 4 + 4);
  } while( true );
LAB_00a24bf2:
  fVar155 = *(float *)(ray + k * 4 + 0x80);
  auVar136._4_4_ = -(uint)(fStack_2b4 <= fVar155);
  auVar136._0_4_ = -(uint)(local_2b8 <= fVar155);
  auVar136._8_4_ = -(uint)(fStack_2b0 <= fVar155);
  auVar136._12_4_ = -(uint)(fStack_2ac <= fVar155);
  uVar55 = movmskps((int)pauVar48,auVar136);
  uVar55 = (uint)uVar54 & uVar55;
  if (uVar55 == 0) {
    return;
  }
  goto LAB_00a22257;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }